

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O3

void test_bson_alloc(void)

{
  char cVar1;
  int iVar2;
  uint *puVar3;
  byte *pbVar4;
  int *piVar5;
  bson_t *pbVar6;
  bson_t *pbVar7;
  bson_t *pbVar8;
  char *pcVar9;
  long lVar10;
  undefined8 uVar11;
  char *pcVar12;
  bson_t *b;
  char *pcVar13;
  uint uVar14;
  byte *unaff_RBX;
  code *pcVar15;
  code **ppcVar16;
  code **__haystack;
  int *unaff_R12;
  long *plVar17;
  undefined1 *unaff_R13;
  undefined1 *puVar18;
  undefined1 *puVar19;
  long lStack_1640;
  int iStack_1634;
  undefined1 auStack_1630 [8];
  char *pcStack_1628;
  undefined4 uStack_1620;
  undefined4 uStack_161c;
  undefined2 uStack_1618;
  undefined2 uStack_1616;
  undefined4 uStack_1614;
  undefined2 uStack_1610;
  undefined8 uStack_160e;
  undefined1 auStack_1600 [128];
  undefined1 auStack_1580 [368];
  undefined1 *puStack_1410;
  code *pcStack_1408;
  long lStack_1398;
  undefined7 uStack_1390;
  char cStack_1389;
  undefined1 uStack_1388;
  undefined1 auStack_1380 [128];
  undefined1 auStack_1300 [376];
  code *apcStack_1188 [16];
  undefined1 auStack_1108 [8];
  undefined1 auStack_1100 [128];
  undefined1 auStack_1080 [128];
  undefined1 auStack_1000 [272];
  undefined8 uStack_ef0;
  char *pcStack_ee8;
  char *pcStack_ee0;
  bson_t *pbStack_ed8;
  undefined8 uStack_ed0;
  char *pcStack_ec8;
  char *pcStack_ec0;
  bson_t *pbStack_eb8;
  long *plStack_eb0;
  bson_t *pbStack_ea8;
  bson_t *pbStack_ea0;
  char *pcStack_e98;
  code *apcStack_e90 [2];
  long lStack_e80;
  int iStack_e78;
  int iStack_e74;
  undefined1 auStack_e70 [504];
  char acStack_c78 [72];
  bson_t *pbStack_c30;
  int *piStack_c28;
  undefined1 *puStack_c20;
  char *pcStack_c18;
  bson_t *pbStack_c10;
  code *pcStack_c08;
  int iStack_b8c;
  undefined1 auStack_b88 [8];
  undefined1 auStack_b80 [248];
  bson_t *pbStack_a88;
  code *apcStack_a80 [2];
  bson_t *pbStack_a70;
  bson_t *pbStack_a68;
  bson_t *pbStack_a60;
  code *pcStack_a58;
  undefined8 uStack_a50;
  undefined4 uStack_a48;
  bson_t *pbStack_a40;
  bson_t *pbStack_a38;
  code *pcStack_a30;
  bson_t *pbStack_a20;
  bson_t *pbStack_a18;
  undefined1 auStack_a08 [24];
  bson_t *apbStack_9f0 [2];
  bson_t *pbStack_9e0;
  bson_t *apbStack_9d8 [2];
  bson_t *pbStack_9c8;
  bson_t *apbStack_9c0 [2];
  bson_t *pbStack_9b0;
  bson_t *apbStack_9a8 [2];
  bson_t *pbStack_998;
  code *apcStack_990 [2];
  bson_t *pbStack_980;
  code *pcStack_978;
  undefined1 auStack_964 [12];
  bson_t *pbStack_958;
  code *pcStack_950;
  bson_t *pbStack_940;
  code *pcStack_938;
  bson_t *pbStack_928;
  code *pcStack_920;
  char *pcStack_910;
  code *pcStack_908;
  undefined1 auStack_900 [128];
  undefined1 auStack_880 [128];
  char acStack_800 [272];
  bson_t *pbStack_6f0;
  int *piStack_6e8;
  code *apcStack_6c8 [2];
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  bson_t *pbStack_6a8;
  code *pcStack_6a0;
  bson_t *pbStack_690;
  code *pcStack_688;
  bson_t *pbStack_678;
  code *pcStack_670;
  bson_t *pbStack_660;
  code *pcStack_658;
  bson_t *pbStack_648;
  bson_t *pbStack_640;
  long alStack_630 [2];
  undefined4 uStack_620;
  undefined1 auStack_61c [20];
  bson_t *apbStack_608 [14];
  undefined1 uStack_591;
  uint32_t uStack_590;
  int iStack_58c;
  undefined8 uStack_588;
  undefined1 auStack_580 [176];
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined7 uStack_4c0;
  undefined1 auStack_4b0 [656];
  bson_t *pbStack_220;
  code *apcStack_200 [2];
  bson_t *pbStack_1f0;
  bson_t *pbStack_1e8;
  bson_t *pbStack_1d8;
  bson_t *pbStack_1d0;
  bson_t *pbStack_1c0;
  bson_t *pbStack_1b8;
  bson_t *pbStack_1a8;
  bson_t *pbStack_1a0;
  undefined1 *puStack_190;
  undefined1 auStack_180 [360];
  byte *pbStack_18;
  
  puVar3 = (uint *)bson_new();
  if (puVar3[1] == 5) {
    uVar14 = *puVar3;
    if ((uVar14 & 1) == 0) {
      test_bson_alloc_cold_14();
LAB_00121226:
      test_bson_alloc_cold_2();
LAB_0012122b:
      test_bson_alloc_cold_3();
LAB_00121230:
      test_bson_alloc_cold_4();
LAB_00121235:
      test_bson_alloc_cold_13();
LAB_0012123a:
      test_bson_alloc_cold_7();
LAB_0012123f:
      test_bson_alloc_cold_9();
LAB_00121244:
      test_bson_alloc_cold_12();
LAB_00121249:
      test_bson_alloc_cold_11();
      goto LAB_0012124e;
    }
    if ((uVar14 & 8) != 0) goto LAB_00121226;
    if ((uVar14 & 2) != 0) goto LAB_0012122b;
    if ((uVar14 & 0x20) != 0) goto LAB_00121230;
    bson_destroy(puVar3);
    pbVar4 = (byte *)bson_sized_new(0x2c);
    if (*(int *)(pbVar4 + 4) != 5) goto LAB_00121253;
    if ((*pbVar4 & 1) == 0) goto LAB_00121235;
    bson_destroy(pbVar4);
    pbVar4 = (byte *)bson_sized_new(0x79);
    if (*(int *)(pbVar4 + 4) != 5) goto LAB_00121258;
    if ((*pbVar4 & 1) != 0) goto LAB_0012123a;
    bson_destroy(pbVar4);
    pbVar4 = (byte *)bson_sized_new(0x81);
    if (*(int *)(pbVar4 + 4) != 5) goto LAB_0012125d;
    if ((*pbVar4 & 1) != 0) goto LAB_0012123f;
    bson_destroy(pbVar4);
    pbVar4 = (byte *)bson_new_from_data("\x05",5);
    if (*(int *)(pbVar4 + 4) == 5) {
      unaff_RBX = pbVar4;
      if ((*pbVar4 & 1) == 0) goto LAB_00121244;
      piVar5 = (int *)bson_get_data(pbVar4);
      if ((char)piVar5[1] == '\0' && *piVar5 == 5) {
        bson_destroy(pbVar4);
        return;
      }
      goto LAB_00121249;
    }
  }
  else {
LAB_0012124e:
    test_bson_alloc_cold_1();
LAB_00121253:
    test_bson_alloc_cold_5();
LAB_00121258:
    test_bson_alloc_cold_6();
LAB_0012125d:
    test_bson_alloc_cold_8();
  }
  test_bson_alloc_cold_10();
  pbStack_18 = unaff_RBX;
  bson_init(auStack_180);
  cVar1 = bson_append_bool(auStack_180,"a",0x7ffffff8,1);
  if (cVar1 == '\0') {
    bson_destroy(auStack_180);
    return;
  }
  test_bson_append_overflow_cold_1();
  pbStack_1a0 = (bson_t *)0x1212bc;
  puStack_190 = auStack_180;
  pbVar6 = (bson_t *)bson_new();
  pbStack_1a0 = (bson_t *)0x1212c4;
  pbVar7 = (bson_t *)bson_new();
  pbStack_1a0 = (bson_t *)0x1212e8;
  cVar1 = bson_append_utf8(pbVar7,"0",0xffffffff,"hello",0xffffffff);
  if (cVar1 == '\0') {
    pbStack_1a0 = (bson_t *)0x12136a;
    test_bson_append_array_cold_1();
LAB_0012136a:
    pbStack_1a0 = (bson_t *)0x12136f;
    test_bson_append_array_cold_2();
  }
  else {
    pbStack_1a0 = (bson_t *)0x12130d;
    cVar1 = bson_append_utf8(pbVar7,"1",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012136a;
    pbStack_1a0 = (bson_t *)0x121328;
    cVar1 = bson_append_array(pbVar6,"array",0xffffffff,pbVar7);
    if (cVar1 != '\0') {
      pbStack_1a0 = (bson_t *)0x121334;
      bson_destroy(pbVar7);
      pbStack_1a0 = (bson_t *)0x121340;
      pbVar7 = get_bson("test23.bson");
      pbStack_1a0 = (bson_t *)0x12134e;
      BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
      pbStack_1a0 = (bson_t *)0x121356;
      bson_destroy(pbVar6);
      bson_destroy(pbVar7);
      return;
    }
  }
  pbStack_1a0 = (bson_t *)test_bson_append_binary;
  test_bson_append_array_cold_3();
  pbStack_1b8 = (bson_t *)0x12137d;
  pbStack_1a8 = pbVar6;
  pbStack_1a0 = pbVar7;
  pbVar6 = (bson_t *)bson_new();
  pbStack_1b8 = (bson_t *)0x1213a6;
  cVar1 = bson_append_binary(pbVar6,"binary",0xffffffff,0x80,"1234",4);
  if (cVar1 != '\0') {
    pbStack_1b8 = (bson_t *)0x1213b6;
    pbVar7 = get_bson("test24.bson");
    pbStack_1b8 = (bson_t *)0x1213c4;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    pbStack_1b8 = (bson_t *)0x1213cc;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  pbStack_1b8 = (bson_t *)test_bson_append_binary_deprecated;
  test_bson_append_binary_cold_1();
  pbStack_1d0 = (bson_t *)0x1213e9;
  pbStack_1c0 = pbVar6;
  pbStack_1b8 = pbVar7;
  pbVar6 = (bson_t *)bson_new();
  pbStack_1d0 = (bson_t *)0x121412;
  cVar1 = bson_append_binary(pbVar6,"binary",0xffffffff,2,"1234",4);
  if (cVar1 != '\0') {
    pbStack_1d0 = (bson_t *)0x121422;
    pbVar7 = get_bson("binary_deprecated.bson");
    pbStack_1d0 = (bson_t *)0x121430;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    pbStack_1d0 = (bson_t *)0x121438;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  pbStack_1d0 = (bson_t *)test_bson_append_bool;
  test_bson_append_binary_deprecated_cold_1();
  pbStack_1e8 = (bson_t *)0x121455;
  pbStack_1d8 = pbVar6;
  pbStack_1d0 = pbVar7;
  pbVar6 = (bson_t *)bson_new();
  pbStack_1e8 = (bson_t *)0x121471;
  cVar1 = bson_append_bool(pbVar6,"bool",0xffffffff,1);
  if (cVar1 != '\0') {
    pbStack_1e8 = (bson_t *)0x121481;
    pbVar7 = get_bson("test19.bson");
    pbStack_1e8 = (bson_t *)0x12148f;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    pbStack_1e8 = (bson_t *)0x121497;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  pbStack_1e8 = (bson_t *)test_bson_append_code;
  test_bson_append_bool_cold_1();
  apcStack_200[0] = (code *)0x1214b4;
  pbStack_1f0 = pbVar6;
  pbStack_1e8 = pbVar7;
  pbVar6 = (bson_t *)bson_new();
  apcStack_200[0] = (code *)0x1214d2;
  cVar1 = bson_append_code(pbVar6,"code",0xffffffff,"var a = {};");
  if (cVar1 != '\0') {
    apcStack_200[0] = (code *)0x1214e2;
    pbVar7 = get_bson("test29.bson");
    apcStack_200[0] = (code *)0x1214f0;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    apcStack_200[0] = (code *)0x1214f8;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  apcStack_200[0] = test_bson_append_code_with_scope;
  test_bson_append_code_cold_1();
  uStack_588 = 0;
  uStack_590 = 0;
  iStack_58c = 0;
  uStack_4d0 = 0;
  uStack_4cc = 0x10000f;
  uStack_4c8 = 0;
  uStack_4c4 = 0x80000;
  uStack_4c0 = 0x80000;
  apbStack_608[0] = (bson_t *)0x121555;
  pbStack_220 = pbVar6;
  apcStack_200[0] = (code *)&stack0xfffffffffffffff0;
  pbVar6 = (bson_t *)bson_new();
  apbStack_608[0] = (bson_t *)0x121576;
  cVar1 = bson_append_code_with_scope(pbVar6,"code",0xffffffff,"var a = {};",0);
  if (cVar1 == '\0') {
    apbStack_608[0] = (bson_t *)0x12185d;
    test_bson_append_code_with_scope_cold_1();
LAB_0012185d:
    apbStack_608[0] = (bson_t *)0x121862;
    test_bson_append_code_with_scope_cold_2();
LAB_00121862:
    apbStack_608[0] = (bson_t *)0x121867;
    test_bson_append_code_with_scope_cold_3();
LAB_00121867:
    apbStack_608[0] = (bson_t *)0x12186c;
    test_bson_append_code_with_scope_cold_4();
LAB_0012186c:
    apbStack_608[0] = (bson_t *)0x121871;
    test_bson_append_code_with_scope_cold_5();
LAB_00121871:
    apbStack_608[0] = (bson_t *)0x121876;
    test_bson_append_code_with_scope_cold_6();
LAB_00121876:
    apbStack_608[0] = (bson_t *)0x12187b;
    test_bson_append_code_with_scope_cold_7();
LAB_0012187b:
    apbStack_608[0] = (bson_t *)0x121880;
    test_bson_append_code_with_scope_cold_8();
LAB_00121880:
    apbStack_608[0] = (bson_t *)0x121885;
    test_bson_append_code_with_scope_cold_9();
LAB_00121885:
    apbStack_608[0] = (bson_t *)0x12188a;
    test_bson_append_code_with_scope_cold_10();
LAB_0012188a:
    apbStack_608[0] = (bson_t *)0x12188f;
    test_bson_append_code_with_scope_cold_11();
LAB_0012188f:
    apbStack_608[0] = (bson_t *)0x121894;
    test_bson_append_code_with_scope_cold_12();
LAB_00121894:
    apbStack_608[0] = (bson_t *)0x121899;
    test_bson_append_code_with_scope_cold_13();
LAB_00121899:
    pbVar8 = pbVar6;
    apbStack_608[0] = (bson_t *)0x12189e;
    test_bson_append_code_with_scope_cold_20();
LAB_0012189e:
    apbStack_608[0] = (bson_t *)0x1218a3;
    test_bson_append_code_with_scope_cold_14();
LAB_001218a3:
    apbStack_608[0] = (bson_t *)0x1218a8;
    test_bson_append_code_with_scope_cold_19();
LAB_001218a8:
    pbVar6 = pbVar8;
    apbStack_608[0] = (bson_t *)0x1218ad;
    test_bson_append_code_with_scope_cold_18();
LAB_001218ad:
    apbStack_608[0] = (bson_t *)0x1218b2;
    test_bson_append_code_with_scope_cold_17();
LAB_001218b2:
    apbStack_608[0] = (bson_t *)0x1218b7;
    test_bson_append_code_with_scope_cold_15();
  }
  else {
    apbStack_608[0] = (bson_t *)0x12158a;
    pbVar7 = get_bson("test30.bson");
    apbStack_608[0] = (bson_t *)0x121598;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    apbStack_608[0] = (bson_t *)0x1215af;
    cVar1 = bson_iter_init_find(auStack_580,pbVar6,"code");
    if (cVar1 == '\0') goto LAB_0012185d;
    apbStack_608[0] = (bson_t *)0x1215c4;
    iVar2 = bson_iter_type(auStack_580);
    if (iVar2 != 0xd) goto LAB_00121862;
    apbStack_608[0] = (bson_t *)0x1215d5;
    bson_destroy(pbVar6);
    apbStack_608[0] = (bson_t *)0x1215dd;
    bson_destroy(pbVar7);
    apbStack_608[0] = (bson_t *)0x1215e2;
    pbVar7 = (bson_t *)bson_new();
    apbStack_608[0] = (bson_t *)0x1215ea;
    pbVar6 = (bson_t *)bson_new();
    apbStack_608[0] = (bson_t *)0x12160b;
    cVar1 = bson_append_code_with_scope(pbVar7,"code",0xffffffff,"var a = {};",pbVar6);
    if (cVar1 == '\0') goto LAB_00121867;
    apbStack_608[0] = (bson_t *)0x12161f;
    pbVar8 = get_bson("code_w_empty_scope.bson");
    apbStack_608[0] = (bson_t *)0x12162d;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar8);
    apbStack_608[0] = (bson_t *)0x121644;
    cVar1 = bson_iter_init_find(auStack_580,pbVar7,"code");
    if (cVar1 == '\0') goto LAB_0012186c;
    apbStack_608[0] = (bson_t *)0x121659;
    iVar2 = bson_iter_type(auStack_580);
    if (iVar2 != 0xf) goto LAB_00121871;
    apbStack_608[0] = (bson_t *)0x12166a;
    bson_destroy(pbVar7);
    apbStack_608[0] = (bson_t *)0x121672;
    bson_destroy(pbVar8);
    apbStack_608[0] = (bson_t *)0x12167a;
    bson_destroy(pbVar6);
    apbStack_608[0] = (bson_t *)0x12167f;
    pbVar7 = (bson_t *)bson_new();
    apbStack_608[0] = (bson_t *)0x121687;
    pbVar6 = (bson_t *)bson_new();
    apbStack_608[0] = (bson_t *)0x1216ab;
    cVar1 = bson_append_utf8(pbVar6,"foo",0xffffffff,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_00121876;
    apbStack_608[0] = (bson_t *)0x1216d1;
    cVar1 = bson_append_code_with_scope(pbVar7,"code",0xffffffff,"var a = {};",pbVar6);
    if (cVar1 == '\0') goto LAB_0012187b;
    apbStack_608[0] = (bson_t *)0x1216e5;
    pbVar8 = get_bson("test31.bson");
    apbStack_608[0] = (bson_t *)0x1216f3;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar8);
    apbStack_608[0] = (bson_t *)0x12170a;
    cVar1 = bson_iter_init_find(auStack_580,pbVar7,"code");
    if (cVar1 == '\0') goto LAB_00121880;
    apbStack_608[0] = (bson_t *)0x12171f;
    iVar2 = bson_iter_type(auStack_580);
    if (iVar2 != 0xf) goto LAB_00121885;
    unaff_R12 = &iStack_58c;
    apbStack_608[0] = (bson_t *)0x121747;
    pcVar9 = (char *)bson_iter_codewscope(auStack_580,unaff_R12,&uStack_590,&uStack_588);
    if (iStack_58c != 0xb) goto LAB_0012188a;
    if (uStack_590 != pbVar6->len) goto LAB_0012188f;
    apbStack_608[0] = (bson_t *)0x12176e;
    iVar2 = strcmp(pcVar9,"var a = {};");
    if (iVar2 != 0) goto LAB_00121894;
    apbStack_608[0] = (bson_t *)0x12177e;
    bson_destroy(pbVar7);
    apbStack_608[0] = (bson_t *)0x121786;
    bson_destroy(pbVar8);
    apbStack_608[0] = (bson_t *)0x12178e;
    bson_destroy(pbVar6);
    uStack_4d0 = CONCAT31(uStack_4d0._1_3_,0x17);
    apbStack_608[0] = (bson_t *)0x1217a3;
    pbVar8 = (bson_t *)bson_new_from_data(&uStack_4d0,0x17);
    if (pbVar8 == (bson_t *)0x0) goto LAB_00121899;
    apbStack_608[0] = (bson_t *)0x1217bf;
    cVar1 = bson_iter_init(auStack_580,pbVar8);
    if (cVar1 == '\0') goto LAB_0012189e;
    apbStack_608[0] = (bson_t *)0x1217d4;
    cVar1 = bson_iter_next(auStack_580);
    if (cVar1 != '\0') goto LAB_001218a3;
    apbStack_608[0] = (bson_t *)0x1217e4;
    bson_destroy(pbVar8);
    apbStack_608[0] = (bson_t *)0x1217f8;
    pbVar6 = (bson_t *)
             bson_reader_new_from_file
                       ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/cdriver2269.bson"
                        ,auStack_4b0);
    if (pbVar6 == (bson_t *)0x0) goto LAB_001218a8;
    apbStack_608[0] = (bson_t *)0x121811;
    lVar10 = bson_reader_read(pbVar6,&uStack_591);
    if (lVar10 == 0) goto LAB_001218ad;
    apbStack_608[0] = (bson_t *)0x12182a;
    cVar1 = bson_iter_init(auStack_580,lVar10);
    if (cVar1 == '\0') goto LAB_001218b2;
    apbStack_608[0] = (bson_t *)0x12183f;
    cVar1 = bson_iter_next(auStack_580);
    if (cVar1 == '\0') {
      apbStack_608[0] = (bson_t *)0x12184b;
      bson_reader_destroy(pbVar6);
      return;
    }
  }
  apbStack_608[0] = (bson_t *)test_bson_append_dbpointer;
  test_bson_append_code_with_scope_cold_16();
  alStack_630[1] = 0x4000c0000000c;
  uStack_620 = 0;
  alStack_630[0] = 0;
  pbStack_640 = (bson_t *)0x1218e8;
  auStack_61c._12_8_ = pbVar6;
  apbStack_608[0] = pbVar7;
  pbVar7 = (bson_t *)bson_new();
  pbVar6 = (bson_t *)auStack_61c;
  pbStack_640 = (bson_t *)0x1218ff;
  bson_oid_init_from_string(pbVar6,"0123abcd0123abcd0123abcd");
  pbStack_640 = (bson_t *)0x12191d;
  cVar1 = bson_append_dbpointer(pbVar7,"dbpointer",0xffffffff,"foo",pbVar6);
  if (cVar1 == '\0') {
    pbStack_640 = (bson_t *)0x121992;
    test_bson_append_dbpointer_cold_1();
LAB_00121992:
    pbStack_640 = (bson_t *)0x121997;
    test_bson_append_dbpointer_cold_4();
LAB_00121997:
    pbStack_640 = (bson_t *)0x12199c;
    test_bson_append_dbpointer_cold_3();
  }
  else {
    pbStack_640 = (bson_t *)0x12192d;
    pbVar6 = get_bson("test28.bson");
    pbStack_640 = (bson_t *)0x12193b;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pbStack_640 = (bson_t *)0x121943;
    bson_destroy(pbVar7);
    pbStack_640 = (bson_t *)0x12194b;
    bson_destroy(pbVar6);
    pbStack_640 = (bson_t *)0x12195a;
    pbVar8 = (bson_t *)bson_new_from_data(alStack_630 + 1,0xc);
    if (pbVar8 == (bson_t *)0x0) goto LAB_00121992;
    pbStack_640 = (bson_t *)0x121971;
    cVar1 = bson_validate(pbVar8,0,alStack_630);
    pbVar7 = pbVar8;
    if (cVar1 != '\0') goto LAB_00121997;
    if (alStack_630[0] == 6) {
      pbStack_640 = (bson_t *)0x121985;
      bson_destroy(pbVar8);
      return;
    }
  }
  pbStack_640 = (bson_t *)test_bson_append_document;
  test_bson_append_dbpointer_cold_2();
  pcStack_658 = (code *)0x1219aa;
  pbStack_648 = pbVar7;
  pbStack_640 = pbVar6;
  pbVar6 = (bson_t *)bson_new();
  pcStack_658 = (code *)0x1219b2;
  uVar11 = bson_new();
  pcStack_658 = (code *)0x1219cc;
  cVar1 = bson_append_document(pbVar6,"document",0xffffffff,uVar11);
  if (cVar1 != '\0') {
    pcStack_658 = (code *)0x1219d8;
    bson_destroy(uVar11);
    pcStack_658 = (code *)0x1219e4;
    pbVar7 = get_bson("test21.bson");
    pcStack_658 = (code *)0x1219f2;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    pcStack_658 = (code *)0x1219fa;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  pcStack_658 = test_bson_append_double;
  test_bson_append_document_cold_1();
  pcStack_670 = (code *)0x121a17;
  pbStack_660 = pbVar6;
  pcStack_658 = (code *)uVar11;
  pbVar6 = (bson_t *)bson_new();
  pcStack_670 = (code *)0x121a36;
  cVar1 = bson_append_double(0x92a30553,pbVar6,"double",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_670 = (code *)0x121a46;
    pbVar7 = get_bson("test20.bson");
    pcStack_670 = (code *)0x121a54;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    pcStack_670 = (code *)0x121a5c;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  pcStack_670 = test_bson_append_int32;
  test_bson_append_double_cold_1();
  pcStack_688 = (code *)0x121a79;
  pbStack_678 = pbVar6;
  pcStack_670 = (code *)uVar11;
  pbVar6 = (bson_t *)bson_new();
  pcStack_688 = (code *)0x121a95;
  cVar1 = bson_append_int32(pbVar6,"a",0xffffffff,0xffffff85);
  if (cVar1 == '\0') {
    pcStack_688 = (code *)0x121b06;
    test_bson_append_int32_cold_1();
LAB_00121b06:
    pcStack_688 = (code *)0x121b0b;
    test_bson_append_int32_cold_2();
  }
  else {
    pcStack_688 = (code *)0x121aaf;
    cVar1 = bson_append_int32(pbVar6,"c",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_00121b06;
    pcStack_688 = (code *)0x121acc;
    cVar1 = bson_append_int32(pbVar6,"b",0xffffffff,0x7b);
    if (cVar1 != '\0') {
      pcStack_688 = (code *)0x121adc;
      pbVar7 = get_bson("test33.bson");
      pcStack_688 = (code *)0x121aea;
      BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
      pcStack_688 = (code *)0x121af2;
      bson_destroy(pbVar6);
      bson_destroy(pbVar7);
      return;
    }
  }
  pcStack_688 = test_bson_append_int64;
  test_bson_append_int32_cold_3();
  pcStack_6a0 = (code *)0x121b19;
  pbStack_690 = pbVar6;
  pcStack_688 = (code *)uVar11;
  pbVar6 = (bson_t *)bson_new();
  pcStack_6a0 = (code *)0x121b3a;
  cVar1 = bson_append_int64(pbVar6,"a",0xffffffff,100000000000000);
  if (cVar1 != '\0') {
    pcStack_6a0 = (code *)0x121b4a;
    pbVar7 = get_bson("test34.bson");
    pcStack_6a0 = (code *)0x121b58;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    pcStack_6a0 = (code *)0x121b60;
    bson_destroy(pbVar6);
    bson_destroy(pbVar7);
    return;
  }
  pcStack_6a0 = test_bson_append_decimal128;
  test_bson_append_int64_cold_1();
  uStack_6b0 = 0;
  uStack_6b8 = 1;
  apcStack_6c8[0] = (code *)0x121b94;
  pbStack_6a8 = pbVar6;
  pcStack_6a0 = (code *)uVar11;
  pbVar6 = (bson_t *)bson_new();
  apcStack_6c8[0] = (code *)0x121bae;
  cVar1 = bson_append_decimal128(pbVar6,"a",0xffffffff,&uStack_6b8);
  if (cVar1 != '\0') {
    apcStack_6c8[0] = (code *)0x121bbe;
    pbVar7 = get_bson("test58.bson");
    apcStack_6c8[0] = (code *)0x121bcc;
    BSON_ASSERT_BSON_EQUAL(pbVar6,pbVar7);
    apcStack_6c8[0] = (code *)0x121bd4;
    bson_destroy(pbVar6);
    apcStack_6c8[0] = (code *)0x121bdc;
    bson_destroy(pbVar7);
    return;
  }
  apcStack_6c8[0] = test_bson_append_iter;
  test_bson_append_decimal128_cold_1();
  puVar18 = auStack_900;
  puVar19 = auStack_900;
  pcVar9 = acStack_800;
  pcStack_908 = (code *)0x121c11;
  pbStack_6f0 = pbVar6;
  piStack_6e8 = unaff_R12;
  apcStack_6c8[0] = (code *)apcStack_200;
  bson_init(pcVar9);
  pbVar6 = (bson_t *)0x14c71a;
  pcStack_908 = (code *)0x121c2d;
  bson_append_int32(pcVar9,"a",1,1);
  pcStack_908 = (code *)0x121c46;
  bson_append_int32(pcVar9,"b",1,2);
  pcStack_908 = (code *)0x121c5f;
  bson_append_int32(pcVar9,"c",1,3);
  pcStack_908 = (code *)0x121c83;
  bson_append_utf8(pcVar9,"d",1,"hello",5);
  pcStack_908 = (code *)0x121c90;
  bson_init(auStack_880);
  pcStack_908 = (code *)0x121c9e;
  cVar1 = bson_iter_init_find(auStack_900,pcVar9,"a");
  if (cVar1 == '\0') {
    pcStack_908 = (code *)0x121ebe;
    test_bson_append_iter_cold_1();
LAB_00121ebe:
    pcStack_908 = (code *)0x121ec3;
    test_bson_append_iter_cold_2();
LAB_00121ec3:
    pcStack_908 = (code *)0x121ec8;
    test_bson_append_iter_cold_3();
LAB_00121ec8:
    pcStack_908 = (code *)0x121ecd;
    test_bson_append_iter_cold_4();
LAB_00121ecd:
    pcStack_908 = (code *)0x121ed2;
    test_bson_append_iter_cold_5();
LAB_00121ed2:
    pcStack_908 = (code *)0x121ed7;
    test_bson_append_iter_cold_6();
LAB_00121ed7:
    pcStack_908 = (code *)0x121edc;
    test_bson_append_iter_cold_7();
LAB_00121edc:
    pcStack_908 = (code *)0x121ee1;
    test_bson_append_iter_cold_11();
    puVar18 = unaff_R13;
LAB_00121ee1:
    pcStack_908 = (code *)0x121ee6;
    test_bson_append_iter_cold_15();
LAB_00121ee6:
    pcStack_908 = (code *)0x121eeb;
    test_bson_append_iter_cold_9();
LAB_00121eeb:
    pcStack_908 = (code *)0x121ef0;
    test_bson_append_iter_cold_10();
LAB_00121ef0:
    pcStack_908 = (code *)0x121ef5;
    test_bson_append_iter_cold_13();
LAB_00121ef5:
    pcStack_908 = (code *)0x121efa;
    test_bson_append_iter_cold_14();
    puVar19 = puVar18;
LAB_00121efa:
    pcStack_908 = (code *)0x121eff;
    test_bson_append_iter_cold_16();
LAB_00121eff:
    pcStack_908 = (code *)0x121f07;
    test_bson_append_iter_cold_8();
LAB_00121f07:
    pcStack_908 = (code *)0x121f0f;
    test_bson_append_iter_cold_12();
LAB_00121f0f:
    pcStack_908 = (code *)0x121f17;
    test_bson_append_iter_cold_17();
  }
  else {
    pcStack_908 = (code *)0x121cba;
    cVar1 = bson_append_iter(auStack_880,0,0,auStack_900);
    if (cVar1 == '\0') goto LAB_00121ebe;
    unaff_R12 = (int *)0x14e712;
    pcStack_908 = (code *)0x121cdc;
    cVar1 = bson_iter_init_find(auStack_900,acStack_800,"c");
    if (cVar1 == '\0') goto LAB_00121ec3;
    pcStack_908 = (code *)0x121cf8;
    cVar1 = bson_append_iter(auStack_880,0,0,auStack_900);
    if (cVar1 == '\0') goto LAB_00121ec8;
    pcStack_908 = (code *)0x121d17;
    cVar1 = bson_iter_init_find(auStack_900,acStack_800,"d");
    if (cVar1 == '\0') goto LAB_00121ecd;
    pcVar9 = "world";
    pcStack_908 = (code *)0x121d3e;
    cVar1 = bson_append_iter(auStack_880,"world",0xffffffff,auStack_900);
    if (cVar1 == '\0') goto LAB_00121ed2;
    pcStack_908 = (code *)0x121d59;
    bson_iter_init(auStack_900,auStack_880);
    pcStack_908 = (code *)0x121d61;
    cVar1 = bson_iter_next(auStack_900);
    unaff_R13 = auStack_900;
    if (cVar1 == '\0') goto LAB_00121ed7;
    pcStack_908 = (code *)0x121d71;
    pcVar12 = (char *)bson_iter_key(auStack_900);
    if (pcVar12 != "a") {
      pcStack_908 = (code *)0x121d7e;
      pbVar4 = (byte *)bson_iter_key(auStack_900);
      uVar14 = *pbVar4 - 0x61;
      if (uVar14 == 0) {
        uVar14 = (uint)pbVar4[1];
      }
      if (uVar14 == 0) goto LAB_00121d94;
      goto LAB_00121eff;
    }
LAB_00121d94:
    pcStack_908 = (code *)0x121d9c;
    iVar2 = bson_iter_type(auStack_900);
    if (iVar2 != 0x10) goto LAB_00121ee6;
    pcStack_908 = (code *)0x121dad;
    iVar2 = bson_iter_int32(auStack_900);
    puVar18 = auStack_900;
    if (iVar2 != 1) goto LAB_00121eeb;
    pcStack_908 = (code *)0x121dbe;
    cVar1 = bson_iter_next(auStack_900);
    unaff_R13 = auStack_900;
    if (cVar1 == '\0') goto LAB_00121edc;
    pcStack_908 = (code *)0x121dce;
    pcVar12 = (char *)bson_iter_key(auStack_900);
    if (pcVar12 != "c") {
      pcStack_908 = (code *)0x121ddb;
      pbVar4 = (byte *)bson_iter_key(auStack_900);
      uVar14 = *pbVar4 - 99;
      if (uVar14 == 0) {
        uVar14 = (uint)pbVar4[1];
      }
      puVar19 = auStack_900;
      if (uVar14 == 0) goto LAB_00121df1;
      goto LAB_00121f07;
    }
LAB_00121df1:
    pcStack_908 = (code *)0x121df9;
    iVar2 = bson_iter_type(auStack_900);
    puVar18 = auStack_900;
    if (iVar2 != 0x10) goto LAB_00121ef0;
    pcStack_908 = (code *)0x121e0a;
    iVar2 = bson_iter_int32(auStack_900);
    puVar18 = auStack_900;
    if (iVar2 != 3) goto LAB_00121ef5;
    pcStack_908 = (code *)0x121e1b;
    cVar1 = bson_iter_next(auStack_900);
    puVar18 = auStack_900;
    if (cVar1 == '\0') goto LAB_00121ee1;
    pcStack_908 = (code *)0x121e2b;
    iVar2 = bson_iter_type(auStack_900);
    puVar19 = auStack_900;
    if (iVar2 != 2) goto LAB_00121efa;
    pcStack_908 = (code *)0x121e3c;
    pcVar12 = (char *)bson_iter_key(auStack_900);
    if (pcVar12 != "world") {
      pcStack_908 = (code *)0x121e49;
      pcVar12 = (char *)bson_iter_key(auStack_900);
      pcStack_908 = (code *)0x121e58;
      iVar2 = strcmp("world",pcVar12);
      puVar19 = auStack_900;
      if (iVar2 == 0) goto LAB_00121e60;
      goto LAB_00121f0f;
    }
LAB_00121e60:
    pcStack_908 = (code *)0x121e6a;
    pcVar12 = (char *)bson_iter_utf8(auStack_900,0);
    if (pcVar12 == "hello") {
LAB_00121e90:
      pcStack_908 = (code *)0x121e9d;
      bson_destroy(acStack_800);
      pcStack_908 = (code *)0x121eaa;
      bson_destroy(auStack_880);
      return;
    }
    pcStack_908 = (code *)0x121e79;
    pcVar12 = (char *)bson_iter_utf8(auStack_900,0);
    pcStack_908 = (code *)0x121e88;
    iVar2 = strcmp("hello",pcVar12);
    puVar19 = auStack_900;
    if (iVar2 == 0) goto LAB_00121e90;
  }
  pcStack_908 = test_bson_append_maxkey;
  test_bson_append_iter_cold_18();
  pcStack_910 = "hello";
  pcStack_920 = (code *)0x121f28;
  pcStack_908 = (code *)pcVar9;
  pbVar7 = (bson_t *)bson_new();
  pcStack_920 = (code *)0x121f3f;
  cVar1 = bson_append_maxkey(pbVar7,"maxkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_920 = (code *)0x121f4f;
    pbVar6 = get_bson("test37.bson");
    pcStack_920 = (code *)0x121f5d;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_920 = (code *)0x121f65;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  pcStack_920 = test_bson_append_minkey;
  test_bson_append_maxkey_cold_1();
  pcStack_938 = (code *)0x121f82;
  pbStack_928 = pbVar7;
  pcStack_920 = (code *)pcVar9;
  pbVar7 = (bson_t *)bson_new();
  pcStack_938 = (code *)0x121f99;
  cVar1 = bson_append_minkey(pbVar7,"minkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_938 = (code *)0x121fa9;
    pbVar6 = get_bson("test36.bson");
    pcStack_938 = (code *)0x121fb7;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_938 = (code *)0x121fbf;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  pcStack_938 = test_bson_append_null;
  test_bson_append_minkey_cold_1();
  pcStack_950 = (code *)0x121fdc;
  pbStack_940 = pbVar7;
  pcStack_938 = (code *)pcVar9;
  pbVar7 = (bson_t *)bson_new();
  pcStack_950 = (code *)0x121ff3;
  cVar1 = bson_append_null(pbVar7,"hello",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_950 = (code *)0x122003;
    pbVar6 = get_bson("test18.bson");
    pcStack_950 = (code *)0x122011;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_950 = (code *)0x122019;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  pcStack_950 = test_bson_append_oid;
  test_bson_append_null_cold_1();
  pcStack_978 = (code *)0x122048;
  pbStack_958 = pbVar7;
  pcStack_950 = (code *)pcVar9;
  bson_oid_init_from_string(auStack_964,"1234567890abcdef1234abcd");
  pcStack_978 = (code *)0x12204d;
  pbVar7 = (bson_t *)bson_new();
  pcStack_978 = (code *)0x122067;
  cVar1 = bson_append_oid(pbVar7,"oid",0xffffffff,auStack_964);
  if (cVar1 != '\0') {
    pcStack_978 = (code *)0x122077;
    pbVar6 = get_bson("test22.bson");
    pcStack_978 = (code *)0x122085;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_978 = (code *)0x12208d;
    bson_destroy(pbVar7);
    pcStack_978 = (code *)0x122095;
    bson_destroy(pbVar6);
    return;
  }
  pcStack_978 = test_bson_append_regex;
  test_bson_append_oid_cold_1();
  apcStack_990[0] = (code *)0x1220ab;
  pbStack_980 = pbVar7;
  pcStack_978 = (code *)auStack_964;
  pbVar7 = (bson_t *)bson_new();
  apcStack_990[0] = (code *)0x1220d0;
  cVar1 = bson_append_regex(pbVar7,"regex",0xffffffff,"^abcd","ilx");
  if (cVar1 != '\0') {
    apcStack_990[0] = (code *)0x1220e0;
    pbVar6 = get_bson("test27.bson");
    apcStack_990[0] = (code *)0x1220ee;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    apcStack_990[0] = (code *)0x1220f6;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  apcStack_990[0] = test_bson_append_utf8;
  test_bson_append_regex_cold_1();
  apbStack_9a8[0] = (bson_t *)0x122113;
  pbStack_998 = pbVar7;
  apcStack_990[0] = (code *)auStack_964;
  pbVar7 = (bson_t *)bson_new();
  apbStack_9a8[0] = (bson_t *)0x122122;
  pbVar8 = get_bson("test11.bson");
  apbStack_9a8[0] = (bson_t *)0x122146;
  cVar1 = bson_append_utf8(pbVar7,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_9a8[0] = (bson_t *)0x122155;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar8);
    apbStack_9a8[0] = (bson_t *)0x12215d;
    bson_destroy(pbVar7);
    bson_destroy(pbVar8);
    return;
  }
  apbStack_9a8[0] = (bson_t *)test_bson_append_symbol;
  test_bson_append_utf8_cold_1();
  apbStack_9c0[0] = (bson_t *)0x12217a;
  pbStack_9b0 = pbVar7;
  apbStack_9a8[0] = pbVar8;
  pbVar7 = (bson_t *)bson_new();
  apbStack_9c0[0] = (bson_t *)0x122189;
  pbVar8 = get_bson("test32.bson");
  apbStack_9c0[0] = (bson_t *)0x1221ad;
  cVar1 = bson_append_symbol(pbVar7,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_9c0[0] = (bson_t *)0x1221bc;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar8);
    apbStack_9c0[0] = (bson_t *)0x1221c4;
    bson_destroy(pbVar7);
    bson_destroy(pbVar8);
    return;
  }
  apbStack_9c0[0] = (bson_t *)test_bson_append_time_t;
  test_bson_append_symbol_cold_1();
  apbStack_9d8[0] = (bson_t *)0x1221e1;
  pbStack_9c8 = pbVar7;
  apbStack_9c0[0] = pbVar8;
  pbVar7 = (bson_t *)bson_new();
  apbStack_9d8[0] = (bson_t *)0x1221fd;
  cVar1 = bson_append_time_t(pbVar7,"time_t",0xffffffff,0x499602d2);
  if (cVar1 != '\0') {
    apbStack_9d8[0] = (bson_t *)0x12220d;
    pbVar6 = get_bson("test26.bson");
    apbStack_9d8[0] = (bson_t *)0x12221b;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    apbStack_9d8[0] = (bson_t *)0x122223;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  apbStack_9d8[0] = (bson_t *)test_bson_append_timestamp;
  test_bson_append_time_t_cold_1();
  apbStack_9f0[0] = (bson_t *)0x122240;
  pbStack_9e0 = pbVar7;
  apbStack_9d8[0] = pbVar8;
  pbVar7 = (bson_t *)bson_new();
  apbStack_9f0[0] = (bson_t *)0x122262;
  cVar1 = bson_append_timestamp(pbVar7,"timestamp",0xffffffff,0x4d2,0x2694);
  if (cVar1 != '\0') {
    apbStack_9f0[0] = (bson_t *)0x122272;
    pbVar6 = get_bson("test35.bson");
    apbStack_9f0[0] = (bson_t *)0x122280;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    apbStack_9f0[0] = (bson_t *)0x122288;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  apbStack_9f0[0] = (bson_t *)test_bson_append_timeval;
  test_bson_append_timestamp_cold_1();
  b = (bson_t *)auStack_a08;
  auStack_a08._0_4_ = 0x499602d2;
  auStack_a08._4_4_ = 0;
  auStack_a08[8] = '\0';
  auStack_a08[9] = '\0';
  auStack_a08[10] = '\0';
  auStack_a08[0xb] = '\0';
  auStack_a08[0xc] = '\0';
  auStack_a08[0xd] = '\0';
  auStack_a08[0xe] = '\0';
  auStack_a08[0xf] = '\0';
  pbStack_a18 = (bson_t *)0x1222bc;
  auStack_a08._16_8_ = pbVar7;
  apbStack_9f0[0] = pbVar8;
  pbVar7 = (bson_t *)bson_new();
  pbStack_a18 = (bson_t *)0x1222d6;
  cVar1 = bson_append_timeval(pbVar7,"time_t",0xffffffff,b);
  if (cVar1 != '\0') {
    pbStack_a18 = (bson_t *)0x1222e6;
    pbVar6 = get_bson("test26.bson");
    pbStack_a18 = (bson_t *)0x1222f4;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pbStack_a18 = (bson_t *)0x1222fc;
    bson_destroy(pbVar7);
    pbStack_a18 = (bson_t *)0x122304;
    bson_destroy(pbVar6);
    return;
  }
  pbStack_a18 = (bson_t *)test_bson_append_undefined;
  test_bson_append_timeval_cold_1();
  pcStack_a30 = (code *)0x12231a;
  pbStack_a20 = pbVar7;
  pbStack_a18 = b;
  pbVar7 = (bson_t *)bson_new();
  pcStack_a30 = (code *)0x122331;
  cVar1 = bson_append_undefined(pbVar7,"undefined",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_a30 = (code *)0x122341;
    pbVar6 = get_bson("test25.bson");
    pcStack_a30 = (code *)0x12234f;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_a30 = (code *)0x122357;
    bson_destroy(pbVar7);
    bson_destroy(pbVar6);
    return;
  }
  pcStack_a30 = test_bson_append_general;
  test_bson_append_undefined_cold_1();
  pcStack_a30 = (code *)0x14c71a;
  pcStack_a58 = (code *)0x122379;
  pbStack_a40 = pbVar7;
  pbStack_a38 = b;
  pbVar7 = (bson_t *)bson_new();
  pcStack_a58 = (code *)0x122395;
  cVar1 = bson_append_int32(pbVar7,"int",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_a58 = (code *)0x122bb1;
    test_bson_append_general_cold_1();
LAB_00122bb1:
    pcStack_a58 = (code *)0x122bb6;
    test_bson_append_general_cold_2();
LAB_00122bb6:
    pcStack_a58 = (code *)0x122bbb;
    test_bson_append_general_cold_3();
LAB_00122bbb:
    pcStack_a58 = (code *)0x122bc0;
    test_bson_append_general_cold_4();
LAB_00122bc0:
    pcStack_a58 = (code *)0x122bc5;
    test_bson_append_general_cold_5();
LAB_00122bc5:
    pcStack_a58 = (code *)0x122bca;
    test_bson_append_general_cold_6();
LAB_00122bca:
    pcStack_a58 = (code *)0x122bcf;
    test_bson_append_general_cold_7();
LAB_00122bcf:
    pcStack_a58 = (code *)0x122bd4;
    test_bson_append_general_cold_8();
LAB_00122bd4:
    pcStack_a58 = (code *)0x122bd9;
    test_bson_append_general_cold_9();
LAB_00122bd9:
    pcStack_a58 = (code *)0x122bde;
    test_bson_append_general_cold_10();
LAB_00122bde:
    pcStack_a58 = (code *)0x122be3;
    test_bson_append_general_cold_11();
LAB_00122be3:
    pcStack_a58 = (code *)0x122be8;
    test_bson_append_general_cold_12();
LAB_00122be8:
    pcStack_a58 = (code *)0x122bed;
    test_bson_append_general_cold_13();
LAB_00122bed:
    pcStack_a58 = (code *)0x122bf2;
    test_bson_append_general_cold_14();
LAB_00122bf2:
    pcStack_a58 = (code *)0x122bf7;
    test_bson_append_general_cold_15();
LAB_00122bf7:
    pcStack_a58 = (code *)0x122bfc;
    test_bson_append_general_cold_16();
LAB_00122bfc:
    pcStack_a58 = (code *)0x122c01;
    test_bson_append_general_cold_17();
LAB_00122c01:
    pcStack_a58 = (code *)0x122c06;
    test_bson_append_general_cold_18();
LAB_00122c06:
    pcStack_a58 = (code *)0x122c0b;
    test_bson_append_general_cold_19();
LAB_00122c0b:
    pcStack_a58 = (code *)0x122c10;
    test_bson_append_general_cold_20();
LAB_00122c10:
    pcStack_a58 = (code *)0x122c15;
    test_bson_append_general_cold_21();
LAB_00122c15:
    pcStack_a58 = (code *)0x122c1a;
    test_bson_append_general_cold_22();
LAB_00122c1a:
    pcStack_a58 = (code *)0x122c1f;
    test_bson_append_general_cold_23();
LAB_00122c1f:
    pcStack_a58 = (code *)0x122c24;
    test_bson_append_general_cold_24();
LAB_00122c24:
    pcStack_a58 = (code *)0x122c29;
    test_bson_append_general_cold_25();
LAB_00122c29:
    pcStack_a58 = (code *)0x122c2e;
    test_bson_append_general_cold_26();
LAB_00122c2e:
    pcStack_a58 = (code *)0x122c33;
    test_bson_append_general_cold_27();
LAB_00122c33:
    pcStack_a58 = (code *)0x122c38;
    test_bson_append_general_cold_28();
LAB_00122c38:
    pcStack_a58 = (code *)0x122c3d;
    test_bson_append_general_cold_29();
LAB_00122c3d:
    pcStack_a58 = (code *)0x122c42;
    test_bson_append_general_cold_30();
LAB_00122c42:
    pcStack_a58 = (code *)0x122c47;
    test_bson_append_general_cold_31();
LAB_00122c47:
    pcStack_a58 = (code *)0x122c4c;
    test_bson_append_general_cold_32();
LAB_00122c4c:
    pcStack_a58 = (code *)0x122c51;
    test_bson_append_general_cold_33();
LAB_00122c51:
    pcStack_a58 = (code *)0x122c56;
    test_bson_append_general_cold_34();
LAB_00122c56:
    pcStack_a58 = (code *)0x122c5b;
    test_bson_append_general_cold_35();
LAB_00122c5b:
    pcStack_a58 = (code *)0x122c60;
    test_bson_append_general_cold_36();
LAB_00122c60:
    pcStack_a58 = (code *)0x122c65;
    test_bson_append_general_cold_37();
  }
  else {
    pcStack_a58 = (code *)0x1223a9;
    b = get_bson("test1.bson");
    pcStack_a58 = (code *)0x1223b7;
    BSON_ASSERT_BSON_EQUAL(pbVar7,b);
    pcStack_a58 = (code *)0x1223bf;
    bson_destroy(b);
    pcStack_a58 = (code *)0x1223c7;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x1223cc;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1223e8;
    cVar1 = bson_append_int64(pbVar7,"int64",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bb1;
    pcStack_a58 = (code *)0x1223fc;
    b = get_bson("test2.bson");
    pcStack_a58 = (code *)0x12240a;
    BSON_ASSERT_BSON_EQUAL(pbVar7,b);
    pcStack_a58 = (code *)0x122412;
    bson_destroy(b);
    pcStack_a58 = (code *)0x12241a;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x12241f;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x12243e;
    cVar1 = bson_append_double(0xd916872b,pbVar7,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bb6;
    pcStack_a58 = (code *)0x122452;
    b = get_bson("test3.bson");
    pcStack_a58 = (code *)0x122460;
    BSON_ASSERT_BSON_EQUAL(pbVar7,b);
    pcStack_a58 = (code *)0x122468;
    bson_destroy(b);
    pcStack_a58 = (code *)0x122470;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x122475;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122499;
    cVar1 = bson_append_utf8(pbVar7,"string",0xffffffff,"some string",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bbb;
    pcStack_a58 = (code *)0x1224ad;
    pbVar8 = get_bson("test5.bson");
    pcStack_a58 = (code *)0x1224bb;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar8);
    pcStack_a58 = (code *)0x1224c3;
    bson_destroy(pbVar8);
    pcStack_a58 = (code *)0x1224cb;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x1224d0;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1224d8;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1224f4;
    cVar1 = bson_append_int32(b,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bc0;
    pcStack_a58 = (code *)0x122515;
    cVar1 = bson_append_int32(b,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_00122bc5;
    pcStack_a58 = (code *)0x122536;
    cVar1 = bson_append_int32(b,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_00122bca;
    pcStack_a58 = (code *)0x122557;
    cVar1 = bson_append_int32(b,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_00122bcf;
    pcStack_a58 = (code *)0x122578;
    cVar1 = bson_append_int32(b,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_00122bd4;
    pcStack_a58 = (code *)0x122599;
    cVar1 = bson_append_int32(b,"5",0xffffffff,6);
    if (cVar1 == '\0') goto LAB_00122bd9;
    pcStack_a58 = (code *)0x1225b8;
    cVar1 = bson_append_array(pbVar7,"array[int]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bde;
    pcStack_a58 = (code *)0x1225cc;
    pbVar6 = get_bson("test6.bson");
    pcStack_a58 = (code *)0x1225da;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_a58 = (code *)0x1225e2;
    bson_destroy(pbVar6);
    pcStack_a58 = (code *)0x1225ea;
    bson_destroy(b);
    pcStack_a58 = (code *)0x1225f2;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x1225f7;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1225ff;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x12261e;
    cVar1 = bson_append_double(0xd916872b,b,"0",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122be3;
    pcStack_a58 = (code *)0x122642;
    cVar1 = bson_append_double(0x6c8b4396,b,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122be8;
    pcStack_a58 = (code *)0x122661;
    cVar1 = bson_append_array(pbVar7,"array[double]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bed;
    pcStack_a58 = (code *)0x122675;
    pbVar6 = get_bson("test7.bson");
    pcStack_a58 = (code *)0x122683;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_a58 = (code *)0x12268b;
    bson_destroy(pbVar6);
    pcStack_a58 = (code *)0x122693;
    bson_destroy(b);
    pcStack_a58 = (code *)0x12269b;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x1226a0;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1226a8;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1226c4;
    cVar1 = bson_append_int32(b,"int",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bf2;
    pcStack_a58 = (code *)0x1226e3;
    cVar1 = bson_append_document(pbVar7,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bf7;
    pcStack_a58 = (code *)0x1226f7;
    pbVar6 = get_bson("test8.bson");
    pcStack_a58 = (code *)0x122705;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
    pcStack_a58 = (code *)0x12270d;
    bson_destroy(pbVar6);
    pcStack_a58 = (code *)0x122715;
    bson_destroy(b);
    pcStack_a58 = (code *)0x12271d;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x122722;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122739;
    cVar1 = bson_append_null(pbVar7,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bfc;
    pcStack_a58 = (code *)0x12274d;
    b = get_bson("test9.bson");
    pcStack_a58 = (code *)0x12275b;
    BSON_ASSERT_BSON_EQUAL(pbVar7,b);
    pcStack_a58 = (code *)0x122763;
    bson_destroy(b);
    pcStack_a58 = (code *)0x12276b;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x122770;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122795;
    cVar1 = bson_append_regex(pbVar7,"regex",0xffffffff,"1234","i");
    if (cVar1 == '\0') goto LAB_00122c01;
    pcStack_a58 = (code *)0x1227a9;
    b = get_bson("test10.bson");
    pcStack_a58 = (code *)0x1227b7;
    BSON_ASSERT_BSON_EQUAL(pbVar7,b);
    pcStack_a58 = (code *)0x1227bf;
    bson_destroy(b);
    pcStack_a58 = (code *)0x1227c7;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x1227cc;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x1227f0;
    cVar1 = bson_append_utf8(pbVar7,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c06;
    pcStack_a58 = (code *)0x122804;
    pbVar8 = get_bson("test11.bson");
    pcStack_a58 = (code *)0x122812;
    BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar8);
    pcStack_a58 = (code *)0x12281a;
    bson_destroy(pbVar8);
    pcStack_a58 = (code *)0x122822;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x122827;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x12282f;
    pbVar7 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122853;
    cVar1 = bson_append_utf8(pbVar7,"0",0xffffffff,"awesome",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c0b;
    pcStack_a58 = (code *)0x122877;
    cVar1 = bson_append_double(0x33333333,pbVar7,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c10;
    pcStack_a58 = (code *)0x122898;
    cVar1 = bson_append_int32(pbVar7,"2",0xffffffff,0x7c2);
    if (cVar1 == '\0') goto LAB_00122c15;
    pcStack_a58 = (code *)0x1228b7;
    cVar1 = bson_append_array(b,"BSON",0xffffffff,pbVar7);
    if (cVar1 == '\0') goto LAB_00122c1a;
    pcStack_a58 = (code *)0x1228cb;
    pbVar6 = get_bson("test12.bson");
    pcStack_a58 = (code *)0x1228d9;
    BSON_ASSERT_BSON_EQUAL(b,pbVar6);
    pcStack_a58 = (code *)0x1228e1;
    bson_destroy(pbVar6);
    pcStack_a58 = (code *)0x1228e9;
    bson_destroy(b);
    pcStack_a58 = (code *)0x1228f1;
    bson_destroy(pbVar7);
    pcStack_a58 = (code *)0x1228f6;
    pbVar7 = (bson_t *)bson_new();
    uStack_a50 = 0;
    uStack_a48 = 0x45230100;
    pcStack_a58 = (code *)0x12291e;
    cVar1 = bson_append_oid(pbVar7,"_id",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c1f;
    pcStack_a58 = (code *)0x12292b;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122945;
    cVar1 = bson_append_oid(b,"_id",0xffffffff,&uStack_a50);
    if (cVar1 == '\0') goto LAB_00122c24;
    pcStack_a58 = (code *)0x122952;
    pbVar6 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122976;
    cVar1 = bson_append_utf8(pbVar6,"0",0xffffffff,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c29;
    pcStack_a58 = (code *)0x12299f;
    cVar1 = bson_append_utf8(pbVar6,"1",0xffffffff,"2",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c2e;
    pcStack_a58 = (code *)0x1229c8;
    cVar1 = bson_append_utf8(pbVar6,"2",0xffffffff,"3",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c33;
    pcStack_a58 = (code *)0x1229f1;
    cVar1 = bson_append_utf8(pbVar6,"3",0xffffffff,"4",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c38;
    pcStack_a58 = (code *)0x122a10;
    cVar1 = bson_append_array(b,"tags",0xffffffff,pbVar6);
    if (cVar1 == '\0') goto LAB_00122c3d;
    pcStack_a58 = (code *)0x122a20;
    bson_destroy(pbVar6);
    pcStack_a58 = (code *)0x122a41;
    cVar1 = bson_append_utf8(b,"text",0xffffffff,"asdfanother",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c42;
    pcStack_a58 = (code *)0x122a4e;
    pbVar6 = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122a72;
    cVar1 = bson_append_utf8(pbVar6,"name",0xffffffff,"blah",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c47;
    pcStack_a58 = (code *)0x122a91;
    cVar1 = bson_append_document(b,"source",0xffffffff,pbVar6);
    if (cVar1 == '\0') goto LAB_00122c4c;
    pcStack_a58 = (code *)0x122aa1;
    bson_destroy(pbVar6);
    pcStack_a58 = (code *)0x122ab8;
    cVar1 = bson_append_document(pbVar7,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c51;
    pcStack_a58 = (code *)0x122ac8;
    bson_destroy(b);
    pcStack_a58 = (code *)0x122acd;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122af1;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"source",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c56;
    pcStack_a58 = (code *)0x122b10;
    cVar1 = bson_append_array(pbVar7,"type",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c5b;
    pcStack_a58 = (code *)0x122b20;
    bson_destroy(b);
    pcStack_a58 = (code *)0x122b25;
    b = (bson_t *)bson_new();
    pcStack_a58 = (code *)0x122b49;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"server_created_at",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c60;
    pcStack_a58 = (code *)0x122b68;
    cVar1 = bson_append_array(pbVar7,"missing",0xffffffff,b);
    if (cVar1 != '\0') {
      pcStack_a58 = (code *)0x122b78;
      bson_destroy(b);
      pcStack_a58 = (code *)0x122b84;
      pbVar6 = get_bson("test17.bson");
      pcStack_a58 = (code *)0x122b92;
      BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
      pcStack_a58 = (code *)0x122b9a;
      bson_destroy(pbVar6);
      pcStack_a58 = (code *)0x122ba2;
      bson_destroy(pbVar7);
      return;
    }
  }
  pcStack_a58 = test_bson_append_deep;
  test_bson_append_general_cold_38();
  pcVar15 = (code *)0x64;
  apcStack_a80[0] = (code *)0x122c7b;
  pbStack_a70 = pbVar7;
  pbStack_a68 = b;
  pbStack_a60 = pbVar6;
  pcStack_a58 = (code *)apcStack_6c8;
  pbVar6 = (bson_t *)bson_new();
  while( true ) {
    apcStack_a80[0] = (code *)0x122c8a;
    pbVar7 = (bson_t *)bson_new();
    apcStack_a80[0] = (code *)0x122ca0;
    cVar1 = bson_append_document(pbVar7,"a",0xffffffff,pbVar6);
    if (cVar1 == '\0') break;
    apcStack_a80[0] = (code *)0x122cac;
    bson_destroy(pbVar6);
    uVar14 = (int)pcVar15 - 1;
    pcVar15 = (code *)(ulong)uVar14;
    pbVar6 = pbVar7;
    if (uVar14 == 0) {
      apcStack_a80[0] = (code *)0x122cbf;
      pbVar6 = get_bson("test38.bson");
      apcStack_a80[0] = (code *)0x122ccd;
      BSON_ASSERT_BSON_EQUAL(pbVar7,pbVar6);
      apcStack_a80[0] = (code *)0x122cd5;
      bson_destroy(pbVar6);
      bson_destroy(pbVar7);
      return;
    }
  }
  apcStack_a80[0] = test_bson_utf8_key;
  test_bson_append_deep_cold_1();
  __haystack = apcStack_a80;
  pcStack_c08 = (code *)0x122d08;
  pbStack_a88 = pbVar7;
  apcStack_a80[0] = pcVar15;
  pbVar7 = get_bson("eurokey.bson");
  pcStack_c08 = (code *)0x122d1a;
  cVar1 = bson_validate(pbVar7,0,auStack_b88);
  if (cVar1 == '\0') {
    pcStack_c08 = (code *)0x122dac;
    test_bson_utf8_key_cold_1();
LAB_00122dac:
    pcStack_c08 = (code *)0x122db1;
    test_bson_utf8_key_cold_2();
LAB_00122db1:
    pcStack_c08 = (code *)0x122db6;
    test_bson_utf8_key_cold_3();
LAB_00122db6:
    pcStack_c08 = (code *)0x122dbb;
    test_bson_utf8_key_cold_4();
LAB_00122dbb:
    pcStack_c08 = (code *)0x122dc0;
    test_bson_utf8_key_cold_7();
LAB_00122dc0:
    pcStack_c08 = (code *)0x122dc5;
    test_bson_utf8_key_cold_5();
  }
  else {
    pcStack_c08 = (code *)0x122d32;
    cVar1 = bson_iter_init(auStack_b80,pbVar7);
    if (cVar1 == '\0') goto LAB_00122dac;
    pcStack_c08 = (code *)0x122d43;
    cVar1 = bson_iter_next(auStack_b80);
    if (cVar1 == '\0') goto LAB_00122db1;
    pcStack_c08 = (code *)0x122d54;
    pcVar9 = (char *)bson_iter_key(auStack_b80);
    pcStack_c08 = (code *)0x122d63;
    iVar2 = strcmp(pcVar9,anon_var_dwarf_48e4);
    if (iVar2 != 0) goto LAB_00122db6;
    pcStack_c08 = (code *)0x122d79;
    pcVar9 = (char *)bson_iter_utf8(auStack_b80,&iStack_b8c);
    if (pcVar9 == (char *)0x0) goto LAB_00122dbb;
    if (iStack_b8c != 0xf) goto LAB_00122dc0;
    pcStack_c08 = (code *)0x122d94;
    iVar2 = strcmp(pcVar9,anon_var_dwarf_48e4);
    if (iVar2 == 0) {
      pcStack_c08 = (code *)0x122da0;
      bson_destroy(pbVar7);
      return;
    }
  }
  pcStack_c08 = test_bson_validate;
  test_bson_utf8_key_cold_6();
  pcStack_c18 = "a";
  pbVar8 = (bson_t *)0x1;
  pcVar12 = "test%u.bson";
  pcVar9 = acStack_c78;
  plVar17 = &lStack_e80;
  pbStack_c30 = pbVar7;
  piStack_c28 = unaff_R12;
  puStack_c20 = puVar19;
  pbStack_c10 = pbVar6;
  pcStack_c08 = (code *)apcStack_a80;
  do {
    apcStack_e90[0] = (code *)0x122e08;
    bson_snprintf(pcVar9,0x40,"test%u.bson",pbVar8);
    apcStack_e90[0] = (code *)0x122e10;
    pbVar6 = get_bson(pcVar9);
    apcStack_e90[0] = (code *)0x122e20;
    cVar1 = bson_validate(pbVar6,0,plVar17);
    if (cVar1 == '\0') {
      apcStack_e90[0] = (code *)0x123d60;
      test_bson_validate_cold_1();
      goto LAB_00123d60;
    }
    apcStack_e90[0] = (code *)0x122e30;
    bson_destroy(pbVar6);
    uVar14 = (int)pbVar8 + 1;
    pbVar8 = (bson_t *)(ulong)uVar14;
  } while (uVar14 != 0x27);
  apcStack_e90[0] = (code *)0x122e43;
  pbVar8 = get_bson("codewscope.bson");
  apcStack_e90[0] = (code *)0x122e55;
  cVar1 = bson_validate(pbVar8,0,&lStack_e80);
  if (cVar1 == '\0') {
LAB_00123d60:
    apcStack_e90[0] = (code *)0x123d65;
    test_bson_validate_cold_2();
LAB_00123d65:
    apcStack_e90[0] = (code *)0x123d6a;
    test_bson_validate_cold_3();
LAB_00123d6a:
    apcStack_e90[0] = (code *)0x123d6f;
    test_bson_validate_cold_158();
LAB_00123d6f:
    apcStack_e90[0] = (code *)0x123d74;
    test_bson_validate_cold_157();
LAB_00123d74:
    apcStack_e90[0] = (code *)0x123d79;
    test_bson_validate_cold_155();
LAB_00123d79:
    apcStack_e90[0] = (code *)0x123d7e;
    test_bson_validate_cold_154();
LAB_00123d7e:
    apcStack_e90[0] = (code *)0x123d83;
    test_bson_validate_cold_152();
LAB_00123d83:
    apcStack_e90[0] = (code *)0x123d88;
    test_bson_validate_cold_151();
LAB_00123d88:
    apcStack_e90[0] = (code *)0x123d8d;
    test_bson_validate_cold_149();
LAB_00123d8d:
    apcStack_e90[0] = (code *)0x123d92;
    test_bson_validate_cold_148();
LAB_00123d92:
    apcStack_e90[0] = (code *)0x123d97;
    test_bson_validate_cold_146();
LAB_00123d97:
    apcStack_e90[0] = (code *)0x123d9c;
    test_bson_validate_cold_145();
LAB_00123d9c:
    apcStack_e90[0] = (code *)0x123da1;
    test_bson_validate_cold_143();
LAB_00123da1:
    apcStack_e90[0] = (code *)0x123da6;
    test_bson_validate_cold_142();
LAB_00123da6:
    apcStack_e90[0] = (code *)0x123dab;
    test_bson_validate_cold_140();
LAB_00123dab:
    apcStack_e90[0] = (code *)0x123db0;
    test_bson_validate_cold_139();
LAB_00123db0:
    apcStack_e90[0] = (code *)0x123db5;
    test_bson_validate_cold_137();
LAB_00123db5:
    apcStack_e90[0] = (code *)0x123dba;
    test_bson_validate_cold_136();
LAB_00123dba:
    apcStack_e90[0] = (code *)0x123dbf;
    test_bson_validate_cold_134();
LAB_00123dbf:
    apcStack_e90[0] = (code *)0x123dc4;
    test_bson_validate_cold_133();
LAB_00123dc4:
    apcStack_e90[0] = (code *)0x123dc9;
    test_bson_validate_cold_131();
LAB_00123dc9:
    apcStack_e90[0] = (code *)0x123dce;
    test_bson_validate_cold_130();
LAB_00123dce:
    apcStack_e90[0] = (code *)0x123dd3;
    test_bson_validate_cold_128();
LAB_00123dd3:
    apcStack_e90[0] = (code *)0x123dd8;
    test_bson_validate_cold_127();
LAB_00123dd8:
    apcStack_e90[0] = (code *)0x123ddd;
    test_bson_validate_cold_125();
LAB_00123ddd:
    apcStack_e90[0] = (code *)0x123de2;
    test_bson_validate_cold_124();
LAB_00123de2:
    apcStack_e90[0] = (code *)0x123de7;
    test_bson_validate_cold_122();
LAB_00123de7:
    apcStack_e90[0] = (code *)0x123dec;
    test_bson_validate_cold_121();
LAB_00123dec:
    apcStack_e90[0] = (code *)0x123df1;
    test_bson_validate_cold_119();
LAB_00123df1:
    apcStack_e90[0] = (code *)0x123df6;
    test_bson_validate_cold_118();
LAB_00123df6:
    apcStack_e90[0] = (code *)0x123dfb;
    test_bson_validate_cold_116();
LAB_00123dfb:
    apcStack_e90[0] = (code *)0x123e00;
    test_bson_validate_cold_115();
LAB_00123e00:
    apcStack_e90[0] = (code *)0x123e05;
    test_bson_validate_cold_113();
LAB_00123e05:
    apcStack_e90[0] = (code *)0x123e0a;
    test_bson_validate_cold_112();
LAB_00123e0a:
    apcStack_e90[0] = (code *)0x123e0f;
    test_bson_validate_cold_110();
LAB_00123e0f:
    apcStack_e90[0] = (code *)0x123e14;
    test_bson_validate_cold_109();
LAB_00123e14:
    apcStack_e90[0] = (code *)0x123e19;
    test_bson_validate_cold_107();
LAB_00123e19:
    apcStack_e90[0] = (code *)0x123e1e;
    test_bson_validate_cold_106();
LAB_00123e1e:
    apcStack_e90[0] = (code *)0x123e23;
    test_bson_validate_cold_104();
LAB_00123e23:
    apcStack_e90[0] = (code *)0x123e28;
    test_bson_validate_cold_103();
LAB_00123e28:
    apcStack_e90[0] = (code *)0x123e2d;
    test_bson_validate_cold_101();
LAB_00123e2d:
    apcStack_e90[0] = (code *)0x123e32;
    test_bson_validate_cold_100();
LAB_00123e32:
    apcStack_e90[0] = (code *)0x123e37;
    test_bson_validate_cold_98();
LAB_00123e37:
    apcStack_e90[0] = (code *)0x123e3c;
    test_bson_validate_cold_97();
LAB_00123e3c:
    apcStack_e90[0] = (code *)0x123e41;
    test_bson_validate_cold_95();
LAB_00123e41:
    apcStack_e90[0] = (code *)0x123e46;
    test_bson_validate_cold_94();
LAB_00123e46:
    apcStack_e90[0] = (code *)0x123e4b;
    test_bson_validate_cold_92();
LAB_00123e4b:
    apcStack_e90[0] = (code *)0x123e50;
    test_bson_validate_cold_91();
LAB_00123e50:
    apcStack_e90[0] = (code *)0x123e55;
    test_bson_validate_cold_73();
LAB_00123e55:
    apcStack_e90[0] = (code *)0x123e5a;
    test_bson_validate_cold_74();
LAB_00123e5a:
    apcStack_e90[0] = (code *)0x123e5f;
    test_bson_validate_cold_75();
LAB_00123e5f:
    apcStack_e90[0] = (code *)0x123e64;
    test_bson_validate_cold_89();
LAB_00123e64:
    apcStack_e90[0] = (code *)0x123e69;
    test_bson_validate_cold_78();
LAB_00123e69:
    apcStack_e90[0] = (code *)0x123e6e;
    test_bson_validate_cold_87();
LAB_00123e6e:
    apcStack_e90[0] = (code *)0x123e73;
    test_bson_validate_cold_81();
LAB_00123e73:
    apcStack_e90[0] = (code *)0x123e78;
    test_bson_validate_cold_85();
    ppcVar16 = __haystack;
LAB_00123e78:
    apcStack_e90[0] = (code *)0x123e7d;
    test_bson_validate_cold_4();
LAB_00123e7d:
    apcStack_e90[0] = (code *)0x123e82;
    test_bson_validate_cold_5();
    __haystack = ppcVar16;
LAB_00123e82:
    apcStack_e90[0] = (code *)0x123e87;
    test_bson_validate_cold_6();
LAB_00123e87:
    apcStack_e90[0] = (code *)0x123e8f;
    test_bson_validate_cold_156();
LAB_00123e8f:
    apcStack_e90[0] = (code *)0x123e94;
    test_bson_validate_cold_7();
LAB_00123e94:
    apcStack_e90[0] = (code *)0x123e99;
    test_bson_validate_cold_8();
LAB_00123e99:
    apcStack_e90[0] = (code *)0x123e9e;
    test_bson_validate_cold_9();
LAB_00123e9e:
    apcStack_e90[0] = (code *)0x123ea6;
    test_bson_validate_cold_153();
LAB_00123ea6:
    apcStack_e90[0] = (code *)0x123eab;
    test_bson_validate_cold_10();
LAB_00123eab:
    apcStack_e90[0] = (code *)0x123eb0;
    test_bson_validate_cold_11();
LAB_00123eb0:
    apcStack_e90[0] = (code *)0x123eb5;
    test_bson_validate_cold_12();
LAB_00123eb5:
    apcStack_e90[0] = (code *)0x123ebd;
    test_bson_validate_cold_150();
LAB_00123ebd:
    apcStack_e90[0] = (code *)0x123ec2;
    test_bson_validate_cold_13();
LAB_00123ec2:
    apcStack_e90[0] = (code *)0x123ec7;
    test_bson_validate_cold_14();
LAB_00123ec7:
    apcStack_e90[0] = (code *)0x123ecc;
    test_bson_validate_cold_15();
LAB_00123ecc:
    apcStack_e90[0] = (code *)0x123ed4;
    test_bson_validate_cold_147();
LAB_00123ed4:
    apcStack_e90[0] = (code *)0x123ed9;
    test_bson_validate_cold_16();
LAB_00123ed9:
    apcStack_e90[0] = (code *)0x123ede;
    test_bson_validate_cold_17();
LAB_00123ede:
    apcStack_e90[0] = (code *)0x123ee3;
    test_bson_validate_cold_18();
LAB_00123ee3:
    apcStack_e90[0] = (code *)0x123eeb;
    test_bson_validate_cold_144();
LAB_00123eeb:
    apcStack_e90[0] = (code *)0x123ef0;
    test_bson_validate_cold_19();
LAB_00123ef0:
    apcStack_e90[0] = (code *)0x123ef5;
    test_bson_validate_cold_20();
LAB_00123ef5:
    apcStack_e90[0] = (code *)0x123efa;
    test_bson_validate_cold_21();
LAB_00123efa:
    apcStack_e90[0] = (code *)0x123f02;
    test_bson_validate_cold_141();
LAB_00123f02:
    apcStack_e90[0] = (code *)0x123f07;
    test_bson_validate_cold_22();
LAB_00123f07:
    apcStack_e90[0] = (code *)0x123f0c;
    test_bson_validate_cold_23();
LAB_00123f0c:
    apcStack_e90[0] = (code *)0x123f11;
    test_bson_validate_cold_24();
LAB_00123f11:
    apcStack_e90[0] = (code *)0x123f19;
    test_bson_validate_cold_138();
LAB_00123f19:
    apcStack_e90[0] = (code *)0x123f1e;
    test_bson_validate_cold_25();
LAB_00123f1e:
    apcStack_e90[0] = (code *)0x123f23;
    test_bson_validate_cold_26();
LAB_00123f23:
    apcStack_e90[0] = (code *)0x123f28;
    test_bson_validate_cold_27();
LAB_00123f28:
    apcStack_e90[0] = (code *)0x123f30;
    test_bson_validate_cold_135();
LAB_00123f30:
    apcStack_e90[0] = (code *)0x123f35;
    test_bson_validate_cold_28();
LAB_00123f35:
    apcStack_e90[0] = (code *)0x123f3a;
    test_bson_validate_cold_29();
LAB_00123f3a:
    apcStack_e90[0] = (code *)0x123f3f;
    test_bson_validate_cold_30();
LAB_00123f3f:
    apcStack_e90[0] = (code *)0x123f47;
    test_bson_validate_cold_132();
LAB_00123f47:
    apcStack_e90[0] = (code *)0x123f4c;
    test_bson_validate_cold_31();
LAB_00123f4c:
    apcStack_e90[0] = (code *)0x123f51;
    test_bson_validate_cold_32();
LAB_00123f51:
    apcStack_e90[0] = (code *)0x123f56;
    test_bson_validate_cold_33();
LAB_00123f56:
    apcStack_e90[0] = (code *)0x123f5e;
    test_bson_validate_cold_129();
LAB_00123f5e:
    apcStack_e90[0] = (code *)0x123f63;
    test_bson_validate_cold_34();
LAB_00123f63:
    apcStack_e90[0] = (code *)0x123f68;
    test_bson_validate_cold_35();
LAB_00123f68:
    apcStack_e90[0] = (code *)0x123f6d;
    test_bson_validate_cold_36();
LAB_00123f6d:
    apcStack_e90[0] = (code *)0x123f75;
    test_bson_validate_cold_126();
LAB_00123f75:
    apcStack_e90[0] = (code *)0x123f7a;
    test_bson_validate_cold_37();
LAB_00123f7a:
    apcStack_e90[0] = (code *)0x123f7f;
    test_bson_validate_cold_38();
LAB_00123f7f:
    apcStack_e90[0] = (code *)0x123f84;
    test_bson_validate_cold_39();
LAB_00123f84:
    apcStack_e90[0] = (code *)0x123f8c;
    test_bson_validate_cold_123();
LAB_00123f8c:
    apcStack_e90[0] = (code *)0x123f91;
    test_bson_validate_cold_40();
LAB_00123f91:
    apcStack_e90[0] = (code *)0x123f96;
    test_bson_validate_cold_41();
LAB_00123f96:
    apcStack_e90[0] = (code *)0x123f9b;
    test_bson_validate_cold_42();
LAB_00123f9b:
    apcStack_e90[0] = (code *)0x123fa3;
    test_bson_validate_cold_120();
LAB_00123fa3:
    apcStack_e90[0] = (code *)0x123fa8;
    test_bson_validate_cold_43();
LAB_00123fa8:
    apcStack_e90[0] = (code *)0x123fad;
    test_bson_validate_cold_44();
LAB_00123fad:
    apcStack_e90[0] = (code *)0x123fb2;
    test_bson_validate_cold_45();
LAB_00123fb2:
    apcStack_e90[0] = (code *)0x123fba;
    test_bson_validate_cold_117();
LAB_00123fba:
    apcStack_e90[0] = (code *)0x123fbf;
    test_bson_validate_cold_46();
LAB_00123fbf:
    apcStack_e90[0] = (code *)0x123fc4;
    test_bson_validate_cold_47();
LAB_00123fc4:
    apcStack_e90[0] = (code *)0x123fc9;
    test_bson_validate_cold_48();
LAB_00123fc9:
    apcStack_e90[0] = (code *)0x123fd1;
    test_bson_validate_cold_114();
LAB_00123fd1:
    apcStack_e90[0] = (code *)0x123fd6;
    test_bson_validate_cold_49();
LAB_00123fd6:
    apcStack_e90[0] = (code *)0x123fdb;
    test_bson_validate_cold_50();
LAB_00123fdb:
    apcStack_e90[0] = (code *)0x123fe0;
    test_bson_validate_cold_51();
LAB_00123fe0:
    apcStack_e90[0] = (code *)0x123fe8;
    test_bson_validate_cold_111();
LAB_00123fe8:
    apcStack_e90[0] = (code *)0x123fed;
    test_bson_validate_cold_52();
LAB_00123fed:
    apcStack_e90[0] = (code *)0x123ff2;
    test_bson_validate_cold_53();
LAB_00123ff2:
    apcStack_e90[0] = (code *)0x123ff7;
    test_bson_validate_cold_54();
LAB_00123ff7:
    apcStack_e90[0] = (code *)0x123fff;
    test_bson_validate_cold_108();
LAB_00123fff:
    apcStack_e90[0] = (code *)0x124004;
    test_bson_validate_cold_55();
LAB_00124004:
    apcStack_e90[0] = (code *)0x124009;
    test_bson_validate_cold_56();
LAB_00124009:
    apcStack_e90[0] = (code *)0x12400e;
    test_bson_validate_cold_57();
LAB_0012400e:
    apcStack_e90[0] = (code *)0x124016;
    test_bson_validate_cold_105();
LAB_00124016:
    apcStack_e90[0] = (code *)0x12401b;
    test_bson_validate_cold_58();
LAB_0012401b:
    apcStack_e90[0] = (code *)0x124020;
    test_bson_validate_cold_59();
LAB_00124020:
    apcStack_e90[0] = (code *)0x124025;
    test_bson_validate_cold_60();
LAB_00124025:
    apcStack_e90[0] = (code *)0x12402d;
    test_bson_validate_cold_102();
LAB_0012402d:
    apcStack_e90[0] = (code *)0x124032;
    test_bson_validate_cold_61();
LAB_00124032:
    apcStack_e90[0] = (code *)0x124037;
    test_bson_validate_cold_62();
LAB_00124037:
    apcStack_e90[0] = (code *)0x12403c;
    test_bson_validate_cold_63();
LAB_0012403c:
    apcStack_e90[0] = (code *)0x124044;
    test_bson_validate_cold_99();
LAB_00124044:
    apcStack_e90[0] = (code *)0x124049;
    test_bson_validate_cold_64();
LAB_00124049:
    apcStack_e90[0] = (code *)0x12404e;
    test_bson_validate_cold_65();
LAB_0012404e:
    apcStack_e90[0] = (code *)0x124053;
    test_bson_validate_cold_66();
LAB_00124053:
    apcStack_e90[0] = (code *)0x12405b;
    test_bson_validate_cold_96();
LAB_0012405b:
    apcStack_e90[0] = (code *)0x124060;
    test_bson_validate_cold_67();
LAB_00124060:
    apcStack_e90[0] = (code *)0x124065;
    test_bson_validate_cold_68();
LAB_00124065:
    apcStack_e90[0] = (code *)0x12406a;
    test_bson_validate_cold_69();
LAB_0012406a:
    apcStack_e90[0] = (code *)0x124072;
    test_bson_validate_cold_93();
LAB_00124072:
    apcStack_e90[0] = (code *)0x124077;
    test_bson_validate_cold_70();
LAB_00124077:
    apcStack_e90[0] = (code *)0x12407c;
    test_bson_validate_cold_71();
LAB_0012407c:
    apcStack_e90[0] = (code *)0x124081;
    test_bson_validate_cold_72();
LAB_00124081:
    apcStack_e90[0] = (code *)0x124089;
    test_bson_validate_cold_90();
LAB_00124089:
    apcStack_e90[0] = (code *)0x12408e;
    test_bson_validate_cold_76();
LAB_0012408e:
    apcStack_e90[0] = (code *)0x124093;
    test_bson_validate_cold_77();
LAB_00124093:
    apcStack_e90[0] = (code *)0x12409b;
    test_bson_validate_cold_88();
LAB_0012409b:
    apcStack_e90[0] = (code *)0x1240a0;
    test_bson_validate_cold_79();
LAB_001240a0:
    apcStack_e90[0] = (code *)0x1240a5;
    test_bson_validate_cold_80();
LAB_001240a5:
    apcStack_e90[0] = (code *)0x1240ad;
    test_bson_validate_cold_86();
LAB_001240ad:
    apcStack_e90[0] = (code *)0x1240b2;
    test_bson_validate_cold_82();
LAB_001240b2:
    apcStack_e90[0] = (code *)0x1240b7;
    test_bson_validate_cold_83();
  }
  else {
    apcStack_e90[0] = (code *)0x122e65;
    bson_destroy(pbVar8);
    apcStack_e90[0] = (code *)0x122e71;
    pbVar8 = get_bson("empty_key.bson");
    apcStack_e90[0] = (code *)0x122e86;
    cVar1 = bson_validate(pbVar8,7,&lStack_e80);
    if (cVar1 == '\0') goto LAB_00123d65;
    apcStack_e90[0] = (code *)0x122e96;
    bson_destroy(pbVar8);
    apcStack_e90[0] = (code *)0x122ea2;
    pcVar12 = (char *)get_bson("overflow2.bson");
    apcStack_e90[0] = (code *)0x122eb4;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123d6a;
    ppcVar16 = apcStack_a80;
    if (lStack_e80 != 9) goto LAB_00123e78;
    apcStack_e90[0] = (code *)0x122eda;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123d6f;
    ppcVar16 = apcStack_a80;
    if (iStack_e78 != 3) goto LAB_00123e7d;
    __haystack = apcStack_a80;
    if (iStack_e74 != 0) goto LAB_00123e82;
    __haystack = (code **)auStack_e70;
    apcStack_e90[0] = (code *)0x122f0f;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123e87;
    apcStack_e90[0] = (code *)0x122f20;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x122f2c;
    pcVar12 = (char *)get_bson("trailingnull.bson");
    apcStack_e90[0] = (code *)0x122f3e;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123d74;
    if (lStack_e80 != 0xe) goto LAB_00123e8f;
    apcStack_e90[0] = (code *)0x122f64;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123d79;
    if (iStack_e78 != 3) goto LAB_00123e94;
    if (iStack_e74 != 0) goto LAB_00123e99;
    apcStack_e90[0] = (code *)0x122f94;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123e9e;
    apcStack_e90[0] = (code *)0x122fa5;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x122fb1;
    pcVar12 = (char *)get_bson("dollarquery.bson");
    apcStack_e90[0] = (code *)0x122fc6;
    cVar1 = bson_validate(pcVar12,6,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123d7e;
    if (lStack_e80 != 4) goto LAB_00123ea6;
    apcStack_e90[0] = (code *)0x122fef;
    cVar1 = bson_validate_with_error(pcVar12,6,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123d83;
    if (iStack_e78 != 3) goto LAB_00123eab;
    if (iStack_e74 != 2) goto LAB_00123eb0;
    apcStack_e90[0] = (code *)0x123020;
    pcVar13 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$query\"");
    if (pcVar13 == (char *)0x0) goto LAB_00123eb5;
    apcStack_e90[0] = (code *)0x123031;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x12303d;
    pcVar12 = (char *)get_bson("dotquery.bson");
    apcStack_e90[0] = (code *)0x123052;
    cVar1 = bson_validate(pcVar12,6,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123d88;
    if (lStack_e80 != 4) goto LAB_00123ebd;
    apcStack_e90[0] = (code *)0x12307b;
    cVar1 = bson_validate_with_error(pcVar12,6,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123d8d;
    if (iStack_e78 != 3) goto LAB_00123ec2;
    if (iStack_e74 != 4) goto LAB_00123ec7;
    apcStack_e90[0] = (code *)0x1230ac;
    pcVar13 = strstr((char *)__haystack,"keys cannot contain \".\": \"abc.def\"");
    if (pcVar13 == (char *)0x0) goto LAB_00123ecc;
    apcStack_e90[0] = (code *)0x1230bd;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1230c9;
    pcVar12 = (char *)get_bson("overflow3.bson");
    apcStack_e90[0] = (code *)0x1230db;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123d92;
    if (lStack_e80 != 9) goto LAB_00123ed4;
    apcStack_e90[0] = (code *)0x123101;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123d97;
    if (iStack_e78 != 3) goto LAB_00123ed9;
    if (iStack_e74 != 0) goto LAB_00123ede;
    apcStack_e90[0] = (code *)0x123131;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123ee3;
    apcStack_e90[0] = (code *)0x123142;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x12314e;
    pcVar12 = (char *)get_bson("overflow3.bson");
    apcStack_e90[0] = (code *)0x123163;
    cVar1 = bson_validate(pcVar12,1,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123d9c;
    if (lStack_e80 != 9) goto LAB_00123eeb;
    apcStack_e90[0] = (code *)0x12318c;
    cVar1 = bson_validate_with_error(pcVar12,1,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123da1;
    if (iStack_e78 != 3) goto LAB_00123ef0;
    if (iStack_e74 != 0) goto LAB_00123ef5;
    apcStack_e90[0] = (code *)0x1231bc;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123efa;
    apcStack_e90[0] = (code *)0x1231cd;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1231d9;
    pcVar12 = (char *)get_bson("overflow4.bson");
    apcStack_e90[0] = (code *)0x1231eb;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123da6;
    if (lStack_e80 != 9) goto LAB_00123f02;
    apcStack_e90[0] = (code *)0x123211;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123dab;
    if (iStack_e78 != 3) goto LAB_00123f07;
    if (iStack_e74 != 0) goto LAB_00123f0c;
    apcStack_e90[0] = (code *)0x123241;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123f11;
    apcStack_e90[0] = (code *)0x123252;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x12325e;
    pcVar12 = (char *)get_bson("empty_key.bson");
    apcStack_e90[0] = (code *)0x123273;
    cVar1 = bson_validate(pcVar12,0x10,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123db0;
    if (lStack_e80 != 4) goto LAB_00123f19;
    apcStack_e90[0] = (code *)0x12329c;
    cVar1 = bson_validate_with_error(pcVar12,0x10,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123db5;
    if (iStack_e78 != 3) goto LAB_00123f1e;
    if (iStack_e74 != 0x10) goto LAB_00123f23;
    apcStack_e90[0] = (code *)0x1232cd;
    pcVar13 = strstr((char *)__haystack,"empty key");
    if (pcVar13 == (char *)0x0) goto LAB_00123f28;
    apcStack_e90[0] = (code *)0x1232de;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1232ea;
    pcVar12 = (char *)get_bson("test40.bson");
    apcStack_e90[0] = (code *)0x1232fc;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123dba;
    if (lStack_e80 != 6) goto LAB_00123f30;
    apcStack_e90[0] = (code *)0x123322;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123dbf;
    if (iStack_e78 != 3) goto LAB_00123f35;
    if (iStack_e74 != 0) goto LAB_00123f3a;
    apcStack_e90[0] = (code *)0x123352;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123f3f;
    apcStack_e90[0] = (code *)0x123363;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x12336f;
    pcVar12 = (char *)get_bson("test41.bson");
    apcStack_e90[0] = (code *)0x123381;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123dc4;
    if (lStack_e80 != 6) goto LAB_00123f47;
    apcStack_e90[0] = (code *)0x1233a7;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123dc9;
    if (iStack_e78 != 3) goto LAB_00123f4c;
    if (iStack_e74 != 0) goto LAB_00123f51;
    apcStack_e90[0] = (code *)0x1233d7;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123f56;
    apcStack_e90[0] = (code *)0x1233e8;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1233f4;
    pcVar12 = (char *)get_bson("test42.bson");
    apcStack_e90[0] = (code *)0x123406;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123dce;
    if (lStack_e80 != 6) goto LAB_00123f5e;
    apcStack_e90[0] = (code *)0x12342c;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123dd3;
    if (iStack_e78 != 3) goto LAB_00123f63;
    if (iStack_e74 != 0) goto LAB_00123f68;
    apcStack_e90[0] = (code *)0x12345c;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123f6d;
    apcStack_e90[0] = (code *)0x12346d;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123479;
    pcVar12 = (char *)get_bson("test43.bson");
    apcStack_e90[0] = (code *)0x12348b;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123dd8;
    if (lStack_e80 != 6) goto LAB_00123f75;
    apcStack_e90[0] = (code *)0x1234b1;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123ddd;
    if (iStack_e78 != 3) goto LAB_00123f7a;
    if (iStack_e74 != 0) goto LAB_00123f7f;
    apcStack_e90[0] = (code *)0x1234e1;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123f84;
    apcStack_e90[0] = (code *)0x1234f2;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1234fe;
    pcVar12 = (char *)get_bson("test44.bson");
    apcStack_e90[0] = (code *)0x123510;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123de2;
    if (lStack_e80 != 6) goto LAB_00123f8c;
    apcStack_e90[0] = (code *)0x123536;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123de7;
    if (iStack_e78 != 3) goto LAB_00123f91;
    if (iStack_e74 != 0) goto LAB_00123f96;
    apcStack_e90[0] = (code *)0x123566;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123f9b;
    apcStack_e90[0] = (code *)0x123577;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123583;
    pcVar12 = (char *)get_bson("test45.bson");
    apcStack_e90[0] = (code *)0x123595;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123dec;
    if (lStack_e80 != 6) goto LAB_00123fa3;
    apcStack_e90[0] = (code *)0x1235bb;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123df1;
    if (iStack_e78 != 3) goto LAB_00123fa8;
    if (iStack_e74 != 0) goto LAB_00123fad;
    apcStack_e90[0] = (code *)0x1235eb;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123fb2;
    apcStack_e90[0] = (code *)0x1235fc;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123608;
    pcVar12 = (char *)get_bson("test46.bson");
    apcStack_e90[0] = (code *)0x12361a;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123df6;
    if (lStack_e80 != 6) goto LAB_00123fba;
    apcStack_e90[0] = (code *)0x123640;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123dfb;
    if (iStack_e78 != 3) goto LAB_00123fbf;
    if (iStack_e74 != 0) goto LAB_00123fc4;
    apcStack_e90[0] = (code *)0x123670;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123fc9;
    apcStack_e90[0] = (code *)0x123681;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x12368d;
    pcVar12 = (char *)get_bson("test47.bson");
    apcStack_e90[0] = (code *)0x12369f;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e00;
    if (lStack_e80 != 6) goto LAB_00123fd1;
    apcStack_e90[0] = (code *)0x1236c5;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e05;
    if (iStack_e78 != 3) goto LAB_00123fd6;
    if (iStack_e74 != 0) goto LAB_00123fdb;
    apcStack_e90[0] = (code *)0x1236f5;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123fe0;
    apcStack_e90[0] = (code *)0x123706;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123712;
    pcVar12 = (char *)get_bson("test48.bson");
    apcStack_e90[0] = (code *)0x123724;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e0a;
    if (lStack_e80 != 6) goto LAB_00123fe8;
    apcStack_e90[0] = (code *)0x12374a;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e0f;
    if (iStack_e78 != 3) goto LAB_00123fed;
    if (iStack_e74 != 0) goto LAB_00123ff2;
    apcStack_e90[0] = (code *)0x12377a;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00123ff7;
    apcStack_e90[0] = (code *)0x12378b;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123797;
    pcVar12 = (char *)get_bson("test49.bson");
    apcStack_e90[0] = (code *)0x1237a9;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e14;
    if (lStack_e80 != 6) goto LAB_00123fff;
    apcStack_e90[0] = (code *)0x1237cf;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e19;
    if (iStack_e78 != 3) goto LAB_00124004;
    if (iStack_e74 != 0) goto LAB_00124009;
    apcStack_e90[0] = (code *)0x1237ff;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_0012400e;
    apcStack_e90[0] = (code *)0x123810;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x12381c;
    pcVar12 = (char *)get_bson("test50.bson");
    apcStack_e90[0] = (code *)0x12382e;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e1e;
    if (lStack_e80 != 10) goto LAB_00124016;
    apcStack_e90[0] = (code *)0x123854;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e23;
    if (iStack_e78 != 3) goto LAB_0012401b;
    if (iStack_e74 != 0) goto LAB_00124020;
    apcStack_e90[0] = (code *)0x123884;
    pcVar13 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar13 == (char *)0x0) goto LAB_00124025;
    apcStack_e90[0] = (code *)0x123895;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1238a1;
    pcVar12 = (char *)get_bson("test51.bson");
    apcStack_e90[0] = (code *)0x1238b3;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e28;
    if (lStack_e80 != 10) goto LAB_0012402d;
    apcStack_e90[0] = (code *)0x1238d9;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e2d;
    if (iStack_e78 != 3) goto LAB_00124032;
    if (iStack_e74 != 0) goto LAB_00124037;
    apcStack_e90[0] = (code *)0x123909;
    pcVar13 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar13 == (char *)0x0) goto LAB_0012403c;
    apcStack_e90[0] = (code *)0x12391a;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123926;
    pcVar12 = (char *)get_bson("test52.bson");
    apcStack_e90[0] = (code *)0x123938;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e32;
    if (lStack_e80 != 9) goto LAB_00124044;
    apcStack_e90[0] = (code *)0x12395e;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e37;
    if (iStack_e78 != 3) goto LAB_00124049;
    if (iStack_e74 != 0) goto LAB_0012404e;
    apcStack_e90[0] = (code *)0x12398e;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00124053;
    apcStack_e90[0] = (code *)0x12399f;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x1239ab;
    pcVar12 = (char *)get_bson("test53.bson");
    apcStack_e90[0] = (code *)0x1239bd;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e3c;
    if (lStack_e80 != 6) goto LAB_0012405b;
    apcStack_e90[0] = (code *)0x1239e3;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e41;
    if (iStack_e78 != 3) goto LAB_00124060;
    if (iStack_e74 != 0) goto LAB_00124065;
    apcStack_e90[0] = (code *)0x123a13;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_0012406a;
    apcStack_e90[0] = (code *)0x123a24;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123a30;
    pcVar12 = (char *)get_bson("test54.bson");
    apcStack_e90[0] = (code *)0x123a42;
    cVar1 = bson_validate(pcVar12,0,&lStack_e80);
    if (cVar1 != '\0') goto LAB_00123e46;
    if (lStack_e80 != 0xc) goto LAB_00124072;
    apcStack_e90[0] = (code *)0x123a68;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e4b;
    if (iStack_e78 != 3) goto LAB_00124077;
    if (iStack_e74 != 0) goto LAB_0012407c;
    apcStack_e90[0] = (code *)0x123a98;
    pcVar13 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar13 == (char *)0x0) goto LAB_00124081;
    apcStack_e90[0] = (code *)0x123aa9;
    bson_destroy(pcVar12);
    apcStack_e90[0] = (code *)0x123aae;
    pcVar12 = (char *)bson_bcon_magic();
    pbVar8 = (bson_t *)0x14ad57;
    plVar17 = (long *)0x14b008;
    pcStack_e98 = (char *)0x0;
    pbStack_ea0 = (bson_t *)0x14ad57;
    pbStack_ea8 = (bson_t *)0x1;
    plStack_eb0 = (long *)0xf;
    pcStack_ec0 = "$id";
    pcStack_ec8 = "collection";
    uStack_ed0 = 0x123afe;
    pbStack_eb8 = (bson_t *)pcVar12;
    pcVar9 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_e90[0] = (code *)0x123b14;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_e78);
    if (cVar1 == '\0') goto LAB_00123e50;
    apcStack_e90[0] = (code *)0x123b2e;
    cVar1 = bson_validate_with_error(pcVar9,2,&iStack_e78);
    if (cVar1 == '\0') goto LAB_00123e55;
    apcStack_e90[0] = (code *)0x123b3e;
    bson_destroy(pcVar9);
    pcVar9 = "$id";
    pcStack_e98 = (char *)0x0;
    pbStack_ea0 = (bson_t *)0x14ad57;
    pbStack_ea8 = (bson_t *)0x1;
    plStack_eb0 = (long *)0x123b71;
    pbVar6 = (bson_t *)bcon_new(0,"my_dbref","{","$id",pcVar12,0xf);
    apcStack_e90[0] = (code *)0x123b87;
    cVar1 = bson_validate_with_error(pbVar6,0,&iStack_e78);
    if (cVar1 == '\0') goto LAB_00123e5a;
    apcStack_e90[0] = (code *)0x123ba1;
    cVar1 = bson_validate_with_error(pbVar6,2,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e5f;
    if (iStack_e78 != 3) goto LAB_00124089;
    if (iStack_e74 != 2) goto LAB_0012408e;
    apcStack_e90[0] = (code *)0x123bd2;
    pcVar13 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$id\"");
    if (pcVar13 == (char *)0x0) goto LAB_00124093;
    apcStack_e90[0] = (code *)0x123be3;
    bson_destroy(pbVar6);
    pcStack_e98 = (char *)0x0;
    pbStack_ea0 = (bson_t *)0x14ad57;
    pbVar6 = (bson_t *)0x147cde;
    pbStack_ea8 = (bson_t *)0x147cde;
    plStack_eb0 = (long *)0x0;
    pcStack_ec0 = "$ref";
    pcStack_ec8 = "collection";
    uStack_ed0 = 0x123c1b;
    pbStack_eb8 = (bson_t *)pcVar12;
    plVar17 = (long *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_e90[0] = (code *)0x123c31;
    cVar1 = bson_validate_with_error(plVar17,0,&iStack_e78);
    if (cVar1 == '\0') goto LAB_00123e64;
    apcStack_e90[0] = (code *)0x123c4b;
    cVar1 = bson_validate_with_error(plVar17,2,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e69;
    if (iStack_e78 != 3) goto LAB_0012409b;
    if (iStack_e74 != 2) goto LAB_001240a0;
    apcStack_e90[0] = (code *)0x123c7c;
    pcVar13 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$ref\"");
    if (pcVar13 == (char *)0x0) goto LAB_001240a5;
    apcStack_e90[0] = (code *)0x123c8d;
    bson_destroy(plVar17);
    pcStack_e98 = (char *)0x0;
    pbStack_ea0 = (bson_t *)0x14ad57;
    pbStack_ea8 = (bson_t *)0x1;
    plStack_eb0 = (long *)0xf;
    pcStack_ec0 = "$id";
    pcStack_ec8 = (char *)0x2;
    uStack_ed0 = 0xf;
    pcStack_ee0 = "extra";
    pcStack_ee8 = "collection";
    uStack_ef0 = 0x123cd7;
    pbStack_ed8 = (bson_t *)pcVar12;
    pbStack_eb8 = (bson_t *)pcVar12;
    pcVar12 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_e90[0] = (code *)0x123ced;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_e78);
    if (cVar1 == '\0') goto LAB_00123e6e;
    apcStack_e90[0] = (code *)0x123d07;
    cVar1 = bson_validate_with_error(pcVar12,2,&iStack_e78);
    if (cVar1 != '\0') goto LAB_00123e73;
    if (iStack_e78 != 3) goto LAB_001240ad;
    if (iStack_e74 != 2) goto LAB_001240b2;
    apcStack_e90[0] = (code *)0x123d38;
    pcVar13 = strstr((char *)__haystack,"invalid key within DBRef subdocument: \"extra\"");
    if (pcVar13 != (char *)0x0) {
      apcStack_e90[0] = (code *)0x123d49;
      bson_destroy(pcVar12);
      return;
    }
  }
  apcStack_e90[0] = test_bson_validate_dbref;
  test_bson_validate_cold_84();
  apcStack_1188[0] = (code *)0x1240e7;
  pbStack_eb8 = pbVar8;
  plStack_eb0 = plVar17;
  pbStack_ea8 = pbVar6;
  pbStack_ea0 = (bson_t *)pcVar12;
  pcStack_e98 = pcVar9;
  apcStack_e90[0] = (code *)__haystack;
  bson_init(auStack_1100);
  apcStack_1188[0] = (code *)0x124106;
  bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
  apcStack_1188[0] = (code *)0x124127;
  bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
  apcStack_1188[0] = (code *)0x124132;
  bson_append_document_end(auStack_1100,auStack_1080);
  apcStack_1188[0] = (code *)0x124144;
  cVar1 = bson_validate(auStack_1100,2,auStack_1108);
  if (cVar1 == '\0') {
    apcStack_1188[0] = (code *)0x12415c;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124164;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x124183;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x1241a4;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x1241c5;
    bson_append_utf8(auStack_1080,"extra",5,"field",5);
    apcStack_1188[0] = (code *)0x1241d0;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x1241e2;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124ab7;
    apcStack_1188[0] = (code *)0x1241fa;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124202;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x124223;
    bson_append_utf8(auStack_1100,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x124244;
    bson_append_utf8(auStack_1100,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x124256;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124abc;
    apcStack_1188[0] = (code *)0x12426e;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124276;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x124295;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x1242b6;
    bson_append_utf8(auStack_1080,"extra",5,"field",5);
    apcStack_1188[0] = (code *)0x1242d7;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x1242f8;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x124303;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x124315;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124ac1;
    apcStack_1188[0] = (code *)0x12432d;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124335;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x124354;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x124375;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x124396;
    bson_append_utf8(auStack_1080,"$db",3,"bar",3);
    apcStack_1188[0] = (code *)0x1243a1;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x1243b3;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124ac6;
    apcStack_1188[0] = (code *)0x1243cb;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x1243d3;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x1243f2;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x12440b;
    bson_append_int32(auStack_1080,"$ref",4,1);
    apcStack_1188[0] = (code *)0x12442c;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x124437;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x124449;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124acb;
    apcStack_1188[0] = (code *)0x124461;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124469;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x124488;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x1244a1;
    bson_append_int32(auStack_1080,"$ref",4,1);
    apcStack_1188[0] = (code *)0x1244ac;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x1244be;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124ad0;
    apcStack_1188[0] = (code *)0x1244d6;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x1244de;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x1244fd;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x12451e;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x12453f;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x124558;
    bson_append_int32(auStack_1080,"$db",3,1);
    apcStack_1188[0] = (code *)0x124563;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x124575;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124ad5;
    apcStack_1188[0] = (code *)0x12458d;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124595;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x1245b4;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x1245d5;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x1245f6;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x12460f;
    bson_append_int32(auStack_1080,"$db",3,1);
    apcStack_1188[0] = (code *)0x124630;
    bson_append_utf8(auStack_1080,"extra",5,"field",5);
    apcStack_1188[0] = (code *)0x12463b;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x12464d;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124ada;
    apcStack_1188[0] = (code *)0x124665;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x12466d;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x12468c;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x1246ad;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x1246ce;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x1246ef;
    bson_append_utf8(auStack_1080,"extra",5,"field",5);
    apcStack_1188[0] = (code *)0x124710;
    bson_append_utf8(auStack_1080,"$db",3,"baz",3);
    apcStack_1188[0] = (code *)0x12471b;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x12472d;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') goto LAB_00124adf;
    apcStack_1188[0] = (code *)0x124745;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x12474d;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x12476c;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x12478d;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x1247ae;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x1247b9;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x1247cb;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 == '\0') goto LAB_00124ae4;
    apcStack_1188[0] = (code *)0x1247e3;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x1247eb;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x12480a;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x12482e;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x124850;
    bson_append_document_begin(auStack_1080,"$id",3,auStack_1000);
    apcStack_1188[0] = (code *)0x12486d;
    bson_append_utf8(auStack_1000,"$ref",4,"foo2",4);
    apcStack_1188[0] = (code *)0x12488a;
    bson_append_utf8(auStack_1000,"$id",3,"bar2",4);
    apcStack_1188[0] = (code *)0x1248ae;
    bson_append_utf8(auStack_1000,"$db",3,"baz2",4);
    apcStack_1188[0] = (code *)0x1248b9;
    bson_append_document_end(auStack_1080,auStack_1000);
    apcStack_1188[0] = (code *)0x1248d6;
    bson_append_utf8(auStack_1080,"$db",3,"baz",3);
    apcStack_1188[0] = (code *)0x1248e1;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x1248f3;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 == '\0') goto LAB_00124ae9;
    apcStack_1188[0] = (code *)0x12490b;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x124913;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x124932;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x124953;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x124974;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x124995;
    bson_append_utf8(auStack_1080,"$db",3,"baz",3);
    apcStack_1188[0] = (code *)0x1249a0;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x1249b2;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 == '\0') goto LAB_00124aee;
    apcStack_1188[0] = (code *)0x1249ca;
    bson_destroy(auStack_1100);
    apcStack_1188[0] = (code *)0x1249d2;
    bson_init(auStack_1100);
    apcStack_1188[0] = (code *)0x1249f1;
    bson_append_document_begin(auStack_1100,"dbref",5,auStack_1080);
    apcStack_1188[0] = (code *)0x124a12;
    bson_append_utf8(auStack_1080,"$ref",4,"foo",3);
    apcStack_1188[0] = (code *)0x124a33;
    bson_append_utf8(auStack_1080,"$id",3,"bar",3);
    apcStack_1188[0] = (code *)0x124a54;
    bson_append_utf8(auStack_1080,"$db",3,"baz",3);
    apcStack_1188[0] = (code *)0x124a75;
    bson_append_utf8(auStack_1080,"extra",5,"field",5);
    apcStack_1188[0] = (code *)0x124a80;
    bson_append_document_end(auStack_1100,auStack_1080);
    apcStack_1188[0] = (code *)0x124a92;
    cVar1 = bson_validate(auStack_1100,2,auStack_1108);
    if (cVar1 != '\0') {
      apcStack_1188[0] = (code *)0x124aa3;
      bson_destroy(auStack_1100);
      return;
    }
  }
  else {
    apcStack_1188[0] = (code *)0x124ab7;
    test_bson_validate_dbref_cold_14();
LAB_00124ab7:
    apcStack_1188[0] = (code *)0x124abc;
    test_bson_validate_dbref_cold_13();
LAB_00124abc:
    apcStack_1188[0] = (code *)0x124ac1;
    test_bson_validate_dbref_cold_12();
LAB_00124ac1:
    apcStack_1188[0] = (code *)0x124ac6;
    test_bson_validate_dbref_cold_11();
LAB_00124ac6:
    apcStack_1188[0] = (code *)0x124acb;
    test_bson_validate_dbref_cold_10();
LAB_00124acb:
    apcStack_1188[0] = (code *)0x124ad0;
    test_bson_validate_dbref_cold_9();
LAB_00124ad0:
    apcStack_1188[0] = (code *)0x124ad5;
    test_bson_validate_dbref_cold_8();
LAB_00124ad5:
    apcStack_1188[0] = (code *)0x124ada;
    test_bson_validate_dbref_cold_7();
LAB_00124ada:
    apcStack_1188[0] = (code *)0x124adf;
    test_bson_validate_dbref_cold_6();
LAB_00124adf:
    apcStack_1188[0] = (code *)0x124ae4;
    test_bson_validate_dbref_cold_5();
LAB_00124ae4:
    apcStack_1188[0] = (code *)0x124ae9;
    test_bson_validate_dbref_cold_1();
LAB_00124ae9:
    apcStack_1188[0] = (code *)0x124aee;
    test_bson_validate_dbref_cold_2();
LAB_00124aee:
    apcStack_1188[0] = (code *)0x124af3;
    test_bson_validate_dbref_cold_3();
  }
  apcStack_1188[0] = test_bson_validate_bool;
  test_bson_validate_dbref_cold_4();
  _uStack_1390 = 0x100620800000009;
  uStack_1388 = 0;
  lStack_1398 = 0;
  pcStack_1408 = (code *)0x124b38;
  apcStack_1188[0] = (code *)apcStack_e90;
  cVar1 = bson_init_static(auStack_1300,&stack0xffffffffffffec70,9);
  if (cVar1 == '\0') {
    pcStack_1408 = (code *)0x124c37;
    test_bson_validate_bool_cold_1();
LAB_00124c37:
    pcStack_1408 = (code *)0x124c3c;
    test_bson_validate_bool_cold_2();
LAB_00124c3c:
    pcStack_1408 = (code *)0x124c41;
    test_bson_validate_bool_cold_3();
LAB_00124c41:
    pcStack_1408 = (code *)0x124c46;
    test_bson_validate_bool_cold_4();
LAB_00124c46:
    pcStack_1408 = (code *)0x124c4b;
    test_bson_validate_bool_cold_5();
LAB_00124c4b:
    pcStack_1408 = (code *)0x124c50;
    test_bson_validate_bool_cold_6();
LAB_00124c50:
    pcStack_1408 = (code *)0x124c55;
    test_bson_validate_bool_cold_7();
LAB_00124c55:
    pcStack_1408 = (code *)0x124c5a;
    test_bson_validate_bool_cold_8();
LAB_00124c5a:
    pcStack_1408 = (code *)0x124c5f;
    test_bson_validate_bool_cold_12();
LAB_00124c5f:
    pcStack_1408 = (code *)0x124c64;
    test_bson_validate_bool_cold_10();
LAB_00124c64:
    pcStack_1408 = (code *)0x124c69;
    test_bson_validate_bool_cold_11();
  }
  else {
    pcStack_1408 = (code *)0x124b54;
    cVar1 = bson_validate(auStack_1300,0,&lStack_1398);
    if (cVar1 == '\0') goto LAB_00124c37;
    pcStack_1408 = (code *)0x124b71;
    cVar1 = bson_iter_init(auStack_1380,auStack_1300);
    if (cVar1 == '\0') goto LAB_00124c3c;
    pcStack_1408 = (code *)0x124b86;
    cVar1 = bson_iter_next(auStack_1380);
    if (cVar1 == '\0') goto LAB_00124c41;
    pcStack_1408 = (code *)0x124b9b;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 8) goto LAB_00124c46;
    pcStack_1408 = (code *)0x124bb1;
    cVar1 = bson_iter_bool(auStack_1380);
    if (cVar1 == '\0') goto LAB_00124c4b;
    if (cStack_1389 != '\x01') goto LAB_00124c50;
    _uStack_1390 = CONCAT17(0xff,uStack_1390);
    pcStack_1408 = (code *)0x124bdf;
    cVar1 = bson_init_static(auStack_1300,&stack0xffffffffffffec70,9);
    if (cVar1 == '\0') goto LAB_00124c55;
    pcStack_1408 = (code *)0x124bf7;
    cVar1 = bson_validate(auStack_1300,0,&lStack_1398);
    if (cVar1 != '\0') goto LAB_00124c5a;
    if (lStack_1398 == 7) {
      pcStack_1408 = (code *)0x124c18;
      cVar1 = bson_iter_init(auStack_1380,auStack_1300);
      if (cVar1 == '\0') goto LAB_00124c5f;
      pcStack_1408 = (code *)0x124c29;
      cVar1 = bson_iter_next(auStack_1380);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124c64;
    }
  }
  pcStack_1408 = test_bson_validate_dbpointer;
  test_bson_validate_bool_cold_9();
  uStack_1610 = 0xe072;
  uStack_160e = 0x614171c4e917c9;
  uStack_1620 = 0x1a;
  uStack_161c = 0x200610c;
  uStack_1618 = 0;
  uStack_1616 = 0x6200;
  uStack_1614 = 0xfce15600;
  lStack_1640 = 0;
  puStack_1410 = auStack_1100;
  pcStack_1408 = (code *)apcStack_1188;
  cVar1 = bson_init_static(auStack_1580,&uStack_1620,0x1a);
  if (cVar1 == '\0') {
    test_bson_validate_dbpointer_cold_1();
LAB_00124deb:
    test_bson_validate_dbpointer_cold_2();
LAB_00124df0:
    test_bson_validate_dbpointer_cold_3();
LAB_00124df5:
    test_bson_validate_dbpointer_cold_4();
LAB_00124dfa:
    test_bson_validate_dbpointer_cold_5();
LAB_00124dff:
    test_bson_validate_dbpointer_cold_8();
LAB_00124e04:
    test_bson_validate_dbpointer_cold_9();
LAB_00124e09:
    test_bson_validate_dbpointer_cold_13();
LAB_00124e0e:
    test_bson_validate_dbpointer_cold_11();
LAB_00124e13:
    test_bson_validate_dbpointer_cold_12();
LAB_00124e18:
    test_bson_validate_dbpointer_cold_6();
  }
  else {
    cVar1 = bson_validate(auStack_1580,0,&lStack_1640);
    if (cVar1 == '\0') goto LAB_00124deb;
    cVar1 = bson_iter_init(auStack_1600,auStack_1580);
    if (cVar1 == '\0') goto LAB_00124df0;
    cVar1 = bson_iter_next(auStack_1600);
    if (cVar1 == '\0') goto LAB_00124df5;
    iVar2 = bson_iter_type(auStack_1600);
    if (iVar2 != 0xc) goto LAB_00124dfa;
    bson_iter_dbpointer(auStack_1600,&iStack_1634,&pcStack_1628,auStack_1630);
    if ((pcStack_1628 != "b") && ((*pcStack_1628 != 'b' || (pcStack_1628[1] != '\0'))))
    goto LAB_00124e18;
    if (iStack_1634 == 1) {
      if ((char)uStack_1614 != '\0') goto LAB_00124dff;
      uStack_1614 = CONCAT31(uStack_1614._1_3_,0xff);
      cVar1 = bson_init_static(auStack_1580,&uStack_1620,0x1a);
      if (cVar1 == '\0') goto LAB_00124e04;
      cVar1 = bson_validate(auStack_1580,0,&lStack_1640);
      if (cVar1 != '\0') goto LAB_00124e09;
      if (lStack_1640 != 0xc) goto LAB_00124e22;
      cVar1 = bson_iter_init(auStack_1600,auStack_1580);
      if (cVar1 == '\0') goto LAB_00124e0e;
      cVar1 = bson_iter_next(auStack_1600);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124e13;
    }
  }
  test_bson_validate_dbpointer_cold_7();
LAB_00124e22:
  test_bson_validate_dbpointer_cold_10();
  iVar2 = 1000000;
  do {
    uVar11 = bson_new();
    bson_destroy(uVar11);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void
test_bson_alloc (void)
{
   static const uint8_t empty_bson[] = {5, 0, 0, 0, 0};
   bson_t *b;

   b = bson_new ();
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   BSON_ASSERT (!(b->flags & BSON_FLAG_CHILD));
   BSON_ASSERT (!(b->flags & BSON_FLAG_STATIC));
   BSON_ASSERT (!(b->flags & BSON_FLAG_NO_FREE));
   bson_destroy (b);

   /*
    * This checks that we fit in the inline buffer size.
    */
   b = bson_sized_new (44);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   /*
    * Make sure we grow to next power of 2.
    */
   b = bson_sized_new (121);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT (!(b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   /*
    * Make sure we grow to next power of 2.
    */
   b = bson_sized_new (129);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT (!(b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   b = bson_new_from_data (empty_bson, sizeof empty_bson);
   BSON_ASSERT_CMPINT (b->len, ==, sizeof empty_bson);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   BSON_ASSERT (!memcmp (bson_get_data (b), empty_bson, sizeof empty_bson));
   bson_destroy (b);
}